

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [28];
  undefined1 auVar23 [28];
  undefined1 auVar24 [28];
  undefined1 auVar25 [28];
  bool bVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  undefined8 unaff_RBP;
  ulong uVar36;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar50 [16];
  undefined1 auVar101 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar141;
  float t1;
  float fVar142;
  undefined4 uVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vfloat4 b0;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  vfloat4 a0_3;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  __m128 a_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  __m128 a;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar213;
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar216;
  float fVar224;
  float fVar225;
  vfloat4 a0_1;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar234;
  float fVar235;
  vfloat4 a0;
  float fVar236;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  RayQueryContext *local_360;
  ulong local_358;
  long local_350;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar135;
  undefined1 auVar240 [32];
  
  uVar32 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar47 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar50 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  fVar155 = fVar1 * auVar50._0_4_;
  fVar136 = fVar1 * auVar47._0_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar32 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar11);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar32 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar42);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar32 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar46);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar113 = vpmovsxbd_avx2(auVar5);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar32 * 0xc + 6);
  auVar103 = vpmovsxbd_avx2(auVar51);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar32 * 0xd + 6);
  auVar98 = vpmovsxbd_avx2(auVar63);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar32 * 0x12 + 6);
  auVar114 = vpmovsxbd_avx2(auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar32 * 0x13 + 6);
  auVar106 = vpmovsxbd_avx2(auVar49);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar32 * 0x14 + 6);
  auVar93 = vpmovsxbd_avx2(auVar43);
  auVar105 = vcvtdq2ps_avx(auVar93);
  auVar117._4_4_ = fVar136;
  auVar117._0_4_ = fVar136;
  auVar117._8_4_ = fVar136;
  auVar117._12_4_ = fVar136;
  auVar117._16_4_ = fVar136;
  auVar117._20_4_ = fVar136;
  auVar117._24_4_ = fVar136;
  auVar117._28_4_ = fVar136;
  auVar171._8_4_ = 1;
  auVar171._0_8_ = 0x100000001;
  auVar171._12_4_ = 1;
  auVar171._16_4_ = 1;
  auVar171._20_4_ = 1;
  auVar171._24_4_ = 1;
  auVar171._28_4_ = 1;
  auVar107 = ZEXT1632(CONCAT412(fVar1 * auVar47._12_4_,
                                CONCAT48(fVar1 * auVar47._8_4_,
                                         CONCAT44(fVar1 * auVar47._4_4_,fVar136))));
  auVar94 = vpermps_avx2(auVar171,auVar107);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar254 = ZEXT3264(auVar91);
  auVar92 = vpermps_avx512vl(auVar91,auVar107);
  fVar136 = auVar92._0_4_;
  fVar215 = auVar92._4_4_;
  auVar107._4_4_ = fVar215 * auVar97._4_4_;
  auVar107._0_4_ = fVar136 * auVar97._0_4_;
  fVar205 = auVar92._8_4_;
  auVar107._8_4_ = fVar205 * auVar97._8_4_;
  fVar213 = auVar92._12_4_;
  auVar107._12_4_ = fVar213 * auVar97._12_4_;
  fVar214 = auVar92._16_4_;
  auVar107._16_4_ = fVar214 * auVar97._16_4_;
  fVar140 = auVar92._20_4_;
  auVar107._20_4_ = fVar140 * auVar97._20_4_;
  fVar141 = auVar92._24_4_;
  auVar107._24_4_ = fVar141 * auVar97._24_4_;
  auVar107._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar98._4_4_ * fVar215;
  auVar106._0_4_ = auVar98._0_4_ * fVar136;
  auVar106._8_4_ = auVar98._8_4_ * fVar205;
  auVar106._12_4_ = auVar98._12_4_ * fVar213;
  auVar106._16_4_ = auVar98._16_4_ * fVar214;
  auVar106._20_4_ = auVar98._20_4_ * fVar140;
  auVar106._24_4_ = auVar98._24_4_ * fVar141;
  auVar106._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar105._4_4_ * fVar215;
  auVar93._0_4_ = auVar105._0_4_ * fVar136;
  auVar93._8_4_ = auVar105._8_4_ * fVar205;
  auVar93._12_4_ = auVar105._12_4_ * fVar213;
  auVar93._16_4_ = auVar105._16_4_ * fVar214;
  auVar93._20_4_ = auVar105._20_4_ * fVar140;
  auVar93._24_4_ = auVar105._24_4_ * fVar141;
  auVar93._28_4_ = auVar92._28_4_;
  auVar11 = vfmadd231ps_fma(auVar107,auVar94,auVar95);
  auVar42 = vfmadd231ps_fma(auVar106,auVar94,auVar103);
  auVar46 = vfmadd231ps_fma(auVar93,auVar104,auVar94);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar117,auVar96);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar117,auVar113);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar114,auVar117);
  auVar165._4_4_ = fVar155;
  auVar165._0_4_ = fVar155;
  auVar165._8_4_ = fVar155;
  auVar165._12_4_ = fVar155;
  auVar165._16_4_ = fVar155;
  auVar165._20_4_ = fVar155;
  auVar165._24_4_ = fVar155;
  auVar165._28_4_ = fVar155;
  auVar93 = ZEXT1632(CONCAT412(fVar1 * auVar50._12_4_,
                               CONCAT48(fVar1 * auVar50._8_4_,
                                        CONCAT44(fVar1 * auVar50._4_4_,fVar155))));
  auVar106 = vpermps_avx2(auVar171,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  auVar94 = vmulps_avx512vl(auVar93,auVar97);
  auVar110._0_4_ = auVar93._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar93._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar93._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar93._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar93._16_4_ * auVar98._16_4_;
  auVar110._20_4_ = auVar93._20_4_ * auVar98._20_4_;
  auVar110._24_4_ = auVar93._24_4_ * auVar98._24_4_;
  auVar110._28_4_ = 0;
  auVar98._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar98._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar98._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar98._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * auVar105._16_4_;
  auVar98._20_4_ = auVar93._20_4_ * auVar105._20_4_;
  auVar98._24_4_ = auVar93._24_4_ * auVar105._24_4_;
  auVar98._28_4_ = auVar97._28_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar106,auVar95);
  auVar5 = vfmadd231ps_fma(auVar110,auVar106,auVar103);
  auVar51 = vfmadd231ps_fma(auVar98,auVar106,auVar104);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar165,auVar96);
  auVar246 = ZEXT3264(auVar95);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar165,auVar113);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar165,auVar114);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar96 = vandps_avx(ZEXT1632(auVar11),auVar112);
  auVar116._8_4_ = 0x219392ef;
  auVar116._0_8_ = 0x219392ef219392ef;
  auVar116._12_4_ = 0x219392ef;
  auVar116._16_4_ = 0x219392ef;
  auVar116._20_4_ = 0x219392ef;
  auVar116._24_4_ = 0x219392ef;
  auVar116._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar96,auVar116,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar94._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar11._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar11._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar11._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar11._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar42),auVar112);
  uVar36 = vcmpps_avx512vl(auVar96,auVar116,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar91._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar42._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar42._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar42._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar42._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar46),auVar112);
  uVar36 = vcmpps_avx512vl(auVar96,auVar116,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar92._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar46._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar46._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar46._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar46._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar115._16_4_ = 0x3f800000;
  auVar115._20_4_ = 0x3f800000;
  auVar115._24_4_ = 0x3f800000;
  auVar115._28_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar94,auVar96,auVar115);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar91);
  auVar42 = vfnmadd213ps_fma(auVar91,auVar96,auVar115);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar96,auVar96);
  auVar97 = vrcp14ps_avx512vl(auVar92);
  auVar46 = vfnmadd213ps_fma(auVar92,auVar97,auVar115);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 7 + 6));
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar97,auVar97);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vsubps_avx512vl(auVar96,auVar95);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 9 + 6));
  auVar114._4_4_ = auVar11._4_4_ * auVar97._4_4_;
  auVar114._0_4_ = auVar11._0_4_ * auVar97._0_4_;
  auVar114._8_4_ = auVar11._8_4_ * auVar97._8_4_;
  auVar114._12_4_ = auVar11._12_4_ * auVar97._12_4_;
  auVar114._16_4_ = auVar97._16_4_ * 0.0;
  auVar114._20_4_ = auVar97._20_4_ * 0.0;
  auVar114._24_4_ = auVar97._24_4_ * 0.0;
  auVar114._28_4_ = auVar97._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vsubps_avx512vl(auVar96,auVar95);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0xe + 6));
  auVar111._0_4_ = auVar11._0_4_ * auVar95._0_4_;
  auVar111._4_4_ = auVar11._4_4_ * auVar95._4_4_;
  auVar111._8_4_ = auVar11._8_4_ * auVar95._8_4_;
  auVar111._12_4_ = auVar11._12_4_ * auVar95._12_4_;
  auVar111._16_4_ = auVar95._16_4_ * 0.0;
  auVar111._20_4_ = auVar95._20_4_ * 0.0;
  auVar111._24_4_ = auVar95._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar5));
  auVar104._4_4_ = auVar42._4_4_ * auVar96._4_4_;
  auVar104._0_4_ = auVar42._0_4_ * auVar96._0_4_;
  auVar104._8_4_ = auVar42._8_4_ * auVar96._8_4_;
  auVar104._12_4_ = auVar42._12_4_ * auVar96._12_4_;
  auVar104._16_4_ = auVar96._16_4_ * 0.0;
  auVar104._20_4_ = auVar96._20_4_ * 0.0;
  auVar104._24_4_ = auVar96._24_4_ * 0.0;
  auVar104._28_4_ = auVar96._28_4_;
  auVar98 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar5));
  auVar109._0_4_ = auVar42._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar42._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar42._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar42._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x15 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar51));
  auVar105._4_4_ = auVar96._4_4_ * auVar46._4_4_;
  auVar105._0_4_ = auVar96._0_4_ * auVar46._0_4_;
  auVar105._8_4_ = auVar96._8_4_ * auVar46._8_4_;
  auVar105._12_4_ = auVar96._12_4_ * auVar46._12_4_;
  auVar105._16_4_ = auVar96._16_4_ * 0.0;
  auVar105._20_4_ = auVar96._20_4_ * 0.0;
  auVar105._24_4_ = auVar96._24_4_ * 0.0;
  auVar105._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar51));
  auVar108._0_4_ = auVar46._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar46._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar46._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar46._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar114,auVar111);
  auVar95 = vpminsd_avx2(auVar104,auVar109);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95 = vpminsd_avx2(auVar105,auVar108);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar143;
  auVar97._0_4_ = uVar143;
  auVar97._8_4_ = uVar143;
  auVar97._12_4_ = uVar143;
  auVar97._16_4_ = uVar143;
  auVar97._20_4_ = uVar143;
  auVar97._24_4_ = uVar143;
  auVar97._28_4_ = uVar143;
  auVar95 = vmaxps_avx512vl(auVar95,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar96,auVar95);
  auVar96 = vpmaxsd_avx2(auVar114,auVar111);
  auVar95 = vpmaxsd_avx2(auVar104,auVar109);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar95 = vpmaxsd_avx2(auVar105,auVar108);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar143;
  auVar113._0_4_ = uVar143;
  auVar113._8_4_ = uVar143;
  auVar113._12_4_ = uVar143;
  auVar113._16_4_ = uVar143;
  auVar113._20_4_ = uVar143;
  auVar113._24_4_ = uVar143;
  auVar113._28_4_ = uVar143;
  auVar95 = vminps_avx512vl(auVar95,auVar113);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar103._16_4_ = 0x3f800003;
  auVar103._20_4_ = 0x3f800003;
  auVar103._24_4_ = 0x3f800003;
  auVar103._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar103);
  uVar12 = vcmpps_avx512vl(local_78,auVar96,2);
  uVar13 = vpcmpgtd_avx512vl(auVar98,_DAT_01fb4ba0);
  uVar36 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar13));
  auVar11 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar247 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar42);
  auVar256 = ZEXT464(0x3f800000);
  auVar96._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar255 = ZEXT1664(auVar96._0_16_);
LAB_01a2bc4e:
  if (uVar36 == 0) {
    return;
  }
  lVar33 = 0;
  for (uVar32 = uVar36; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  local_358 = (ulong)*(uint *)(prim + lVar33 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar6].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar32 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_358 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar42 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar32);
  lVar33 = uVar32 + 1;
  auVar46 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar33);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar32);
  auVar51 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar33);
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x30);
  auVar79._8_4_ = 0x3eaaaaab;
  auVar79._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar79._12_4_ = 0x3eaaaaab;
  auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar7[2].intersectionFilterN +
                             (long)pGVar7[2].pointQueryFunc * uVar32),auVar42,auVar79);
  auVar47 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar7[2].intersectionFilterN +
                              (long)pGVar7[2].pointQueryFunc * lVar33),auVar46,auVar79);
  auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar7[3].userPtr +
                             uVar32 * *(long *)&pGVar7[3].fnumTimeSegments),auVar5,auVar79);
  auVar50 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar7[3].userPtr +
                              *(long *)&pGVar7[3].fnumTimeSegments * lVar33),auVar51,auVar79);
  auVar100._16_16_ = auVar96._16_16_;
  auVar100._0_16_ = vxorps_avx512vl(auVar246._0_16_,auVar246._0_16_);
  auVar43 = vmulps_avx512vl(auVar46,auVar100._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar100._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar44);
  auVar66._0_4_ = auVar42._0_4_ + auVar43._0_4_;
  auVar66._4_4_ = auVar42._4_4_ + auVar43._4_4_;
  auVar66._8_4_ = auVar42._8_4_ + auVar43._8_4_;
  auVar66._12_4_ = auVar42._12_4_ + auVar43._12_4_;
  auVar65 = auVar247._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar65);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar42,auVar65);
  auVar43 = vmulps_avx512vl(auVar51,auVar100._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar100._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar45);
  auVar88._0_4_ = auVar5._0_4_ + auVar43._0_4_;
  auVar88._4_4_ = auVar5._4_4_ + auVar43._4_4_;
  auVar88._8_4_ = auVar5._8_4_ + auVar43._8_4_;
  auVar88._12_4_ = auVar5._12_4_ + auVar43._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar49,auVar65);
  auVar45 = vfnmadd231ps_avx512vl(auVar43,auVar5,auVar65);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar46);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar100._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar100._0_16_);
  auVar46 = vmulps_avx512vl(auVar46,auVar65);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar65,auVar47);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar100._0_16_,auVar48);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar100._0_16_,auVar42);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar51);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar100._0_16_);
  auVar48 = vfmadd231ps_avx512vl(auVar42,auVar5,auVar100._0_16_);
  auVar42 = vmulps_avx512vl(auVar51,auVar65);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar65,auVar50);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar100._0_16_,auVar49);
  auVar49 = vfnmadd231ps_avx512vl(auVar42,auVar100._0_16_,auVar5);
  auVar42 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar46 = vshufps_avx(auVar88,auVar88,0xc9);
  fVar142 = auVar44._0_4_;
  auVar55._0_4_ = fVar142 * auVar46._0_4_;
  fVar146 = auVar44._4_4_;
  auVar55._4_4_ = fVar146 * auVar46._4_4_;
  fVar147 = auVar44._8_4_;
  auVar55._8_4_ = fVar147 * auVar46._8_4_;
  fVar148 = auVar44._12_4_;
  auVar55._12_4_ = fVar148 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar55,auVar42,auVar88);
  auVar5 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar72._0_4_ = auVar46._0_4_ * fVar142;
  auVar72._4_4_ = auVar46._4_4_ * fVar146;
  auVar72._8_4_ = auVar46._8_4_ * fVar147;
  auVar72._12_4_ = auVar46._12_4_ * fVar148;
  auVar42 = vfmsub231ps_fma(auVar72,auVar42,auVar45);
  auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar46 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar136 = auVar47._0_4_;
  auVar89._0_4_ = auVar46._0_4_ * fVar136;
  fVar215 = auVar47._4_4_;
  auVar89._4_4_ = auVar46._4_4_ * fVar215;
  fVar205 = auVar47._8_4_;
  auVar89._8_4_ = auVar46._8_4_ * fVar205;
  fVar213 = auVar47._12_4_;
  auVar89._12_4_ = auVar46._12_4_ * fVar213;
  auVar46 = vfmsub231ps_fma(auVar89,auVar42,auVar48);
  auVar48 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar73._0_4_ = auVar46._0_4_ * fVar136;
  auVar73._4_4_ = auVar46._4_4_ * fVar215;
  auVar73._8_4_ = auVar46._8_4_ * fVar205;
  auVar73._12_4_ = auVar46._12_4_ * fVar213;
  auVar42 = vfmsub231ps_fma(auVar73,auVar42,auVar49);
  auVar49 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar214 = auVar42._0_4_;
  auVar99._4_28_ = auVar100._4_28_;
  auVar99._0_4_ = fVar214;
  auVar46 = vrsqrt14ss_avx512f(auVar100._0_16_,auVar99._0_16_);
  auVar50 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar140 = auVar46._0_4_;
  fVar141 = auVar50._0_4_ - auVar45._0_4_ * fVar140 * fVar140 * fVar140;
  auVar46 = vdpps_avx(auVar5,auVar51,0x7f);
  fVar227 = fVar141 * auVar5._0_4_;
  fVar234 = fVar141 * auVar5._4_4_;
  fVar235 = fVar141 * auVar5._8_4_;
  fVar236 = fVar141 * auVar5._12_4_;
  auVar76._0_4_ = fVar214 * auVar51._0_4_;
  auVar76._4_4_ = fVar214 * auVar51._4_4_;
  auVar76._8_4_ = fVar214 * auVar51._8_4_;
  auVar76._12_4_ = fVar214 * auVar51._12_4_;
  fVar214 = auVar46._0_4_;
  auVar57._0_4_ = fVar214 * auVar5._0_4_;
  auVar57._4_4_ = fVar214 * auVar5._4_4_;
  auVar57._8_4_ = fVar214 * auVar5._8_4_;
  auVar57._12_4_ = fVar214 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar76,auVar57);
  auVar46 = vrcp14ss_avx512f(auVar100._0_16_,auVar99._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar46,ZEXT416(0x40000000));
  fVar214 = auVar46._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar140 = auVar42._0_4_;
  auVar102._16_16_ = auVar100._16_16_;
  auVar102._0_16_ = auVar100._0_16_;
  auVar101._4_28_ = auVar102._4_28_;
  auVar101._0_4_ = fVar140;
  auVar46 = vrsqrt14ss_avx512f(auVar100._0_16_,auVar101._0_16_);
  auVar51 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar155 = auVar46._0_4_;
  fVar155 = auVar51._0_4_ - auVar50._0_4_ * fVar155 * fVar155 * fVar155;
  auVar46 = vdpps_avx(auVar48,auVar49,0x7f);
  fVar216 = fVar155 * auVar48._0_4_;
  fVar224 = fVar155 * auVar48._4_4_;
  fVar225 = fVar155 * auVar48._8_4_;
  fVar226 = fVar155 * auVar48._12_4_;
  auVar53._0_4_ = fVar140 * auVar49._0_4_;
  auVar53._4_4_ = fVar140 * auVar49._4_4_;
  auVar53._8_4_ = fVar140 * auVar49._8_4_;
  auVar53._12_4_ = fVar140 * auVar49._12_4_;
  fVar140 = auVar46._0_4_;
  auVar52._0_4_ = fVar140 * auVar48._0_4_;
  auVar52._4_4_ = fVar140 * auVar48._4_4_;
  auVar52._8_4_ = fVar140 * auVar48._8_4_;
  auVar52._12_4_ = fVar140 * auVar48._12_4_;
  auVar51 = vsubps_avx(auVar53,auVar52);
  auVar46 = vrcp14ss_avx512f(auVar100._0_16_,auVar101._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar46,ZEXT416(0x40000000));
  fVar140 = auVar42._0_4_ * auVar46._0_4_;
  auVar42 = vshufps_avx(auVar66,auVar66,0xff);
  auVar58._0_4_ = fVar227 * auVar42._0_4_;
  auVar58._4_4_ = fVar234 * auVar42._4_4_;
  auVar58._8_4_ = fVar235 * auVar42._8_4_;
  auVar58._12_4_ = fVar236 * auVar42._12_4_;
  auVar48 = vsubps_avx(auVar66,auVar58);
  auVar46 = vshufps_avx(auVar44,auVar44,0xff);
  auVar56._0_4_ = auVar46._0_4_ * fVar227 + auVar42._0_4_ * fVar141 * fVar214 * auVar5._0_4_;
  auVar56._4_4_ = auVar46._4_4_ * fVar234 + auVar42._4_4_ * fVar141 * fVar214 * auVar5._4_4_;
  auVar56._8_4_ = auVar46._8_4_ * fVar235 + auVar42._8_4_ * fVar141 * fVar214 * auVar5._8_4_;
  auVar56._12_4_ = auVar46._12_4_ * fVar236 + auVar42._12_4_ * fVar141 * fVar214 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar44,auVar56);
  auVar228._0_4_ = auVar58._0_4_ + auVar66._0_4_;
  auVar228._4_4_ = auVar58._4_4_ + auVar66._4_4_;
  auVar228._8_4_ = auVar58._8_4_ + auVar66._8_4_;
  auVar228._12_4_ = auVar58._12_4_ + auVar66._12_4_;
  auVar42 = vshufps_avx(auVar43,auVar43,0xff);
  auVar54._0_4_ = fVar216 * auVar42._0_4_;
  auVar54._4_4_ = fVar224 * auVar42._4_4_;
  auVar54._8_4_ = fVar225 * auVar42._8_4_;
  auVar54._12_4_ = fVar226 * auVar42._12_4_;
  auVar52 = vsubps_avx512vl(auVar43,auVar54);
  auVar46 = vshufps_avx(auVar47,auVar47,0xff);
  auVar67._0_4_ = auVar46._0_4_ * fVar216 + auVar42._0_4_ * fVar155 * auVar51._0_4_ * fVar140;
  auVar67._4_4_ = auVar46._4_4_ * fVar224 + auVar42._4_4_ * fVar155 * auVar51._4_4_ * fVar140;
  auVar67._8_4_ = auVar46._8_4_ * fVar225 + auVar42._8_4_ * fVar155 * auVar51._8_4_ * fVar140;
  auVar67._12_4_ = auVar46._12_4_ * fVar226 + auVar42._12_4_ * fVar155 * auVar51._12_4_ * fVar140;
  auVar42 = vsubps_avx(auVar47,auVar67);
  auVar53 = vaddps_avx512vl(auVar43,auVar54);
  auVar156._0_4_ = auVar5._0_4_ * 0.33333334;
  auVar156._4_4_ = auVar5._4_4_ * 0.33333334;
  auVar156._8_4_ = auVar5._8_4_ * 0.33333334;
  auVar156._12_4_ = auVar5._12_4_ * 0.33333334;
  auVar54 = vaddps_avx512vl(auVar48,auVar156);
  auVar157._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar157._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar157._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar157._12_4_ = auVar42._12_4_ * 0.33333334;
  auVar55 = vsubps_avx512vl(auVar52,auVar157);
  auVar50._0_4_ = (fVar142 + auVar56._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar146 + auVar56._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar147 + auVar56._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar148 + auVar56._12_4_) * 0.33333334;
  auVar56 = vaddps_avx512vl(auVar228,auVar50);
  auVar45._0_4_ = (fVar136 + auVar67._0_4_) * 0.33333334;
  auVar45._4_4_ = (fVar215 + auVar67._4_4_) * 0.33333334;
  auVar45._8_4_ = (fVar205 + auVar67._8_4_) * 0.33333334;
  auVar45._12_4_ = (fVar213 + auVar67._12_4_) * 0.33333334;
  auVar57 = vsubps_avx512vl(auVar53,auVar45);
  auVar49 = vsubps_avx(auVar48,auVar63);
  uVar143 = auVar49._0_4_;
  auVar149._4_4_ = uVar143;
  auVar149._0_4_ = uVar143;
  auVar149._8_4_ = uVar143;
  auVar149._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar49,auVar49,0x55);
  auVar46 = vshufps_avx(auVar49,auVar49,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar136 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar205 = pre->ray_space[k].vz.field_0.m128[2];
  fVar213 = pre->ray_space[k].vz.field_0.m128[3];
  auVar65._0_4_ = fVar136 * auVar46._0_4_;
  auVar65._4_4_ = fVar215 * auVar46._4_4_;
  auVar65._8_4_ = fVar205 * auVar46._8_4_;
  auVar65._12_4_ = fVar213 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar4,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar149);
  auVar58 = vsubps_avx512vl(auVar54,auVar63);
  uVar143 = auVar58._0_4_;
  auVar59._4_4_ = uVar143;
  auVar59._0_4_ = uVar143;
  auVar59._8_4_ = uVar143;
  auVar59._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar58,auVar58,0x55);
  auVar46 = vshufps_avx(auVar58,auVar58,0xaa);
  auVar150._0_4_ = fVar136 * auVar46._0_4_;
  auVar150._4_4_ = fVar215 * auVar46._4_4_;
  auVar150._8_4_ = fVar205 * auVar46._8_4_;
  auVar150._12_4_ = fVar213 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar4,auVar42);
  auVar65 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar59);
  auVar59 = vsubps_avx512vl(auVar55,auVar63);
  uVar143 = auVar59._0_4_;
  auVar61._4_4_ = uVar143;
  auVar61._0_4_ = uVar143;
  auVar61._8_4_ = uVar143;
  auVar61._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar59,auVar59,0x55);
  auVar46 = vshufps_avx(auVar59,auVar59,0xaa);
  auVar60._0_4_ = fVar136 * auVar46._0_4_;
  auVar60._4_4_ = fVar215 * auVar46._4_4_;
  auVar60._8_4_ = fVar205 * auVar46._8_4_;
  auVar60._12_4_ = fVar213 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar4,auVar42);
  auVar66 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar61);
  auVar60 = vsubps_avx512vl(auVar52,auVar63);
  uVar143 = auVar60._0_4_;
  auVar68._4_4_ = uVar143;
  auVar68._0_4_ = uVar143;
  auVar68._8_4_ = uVar143;
  auVar68._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar60,auVar60,0x55);
  auVar46 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar62._0_4_ = fVar136 * auVar46._0_4_;
  auVar62._4_4_ = fVar215 * auVar46._4_4_;
  auVar62._8_4_ = fVar205 * auVar46._8_4_;
  auVar62._12_4_ = fVar213 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar4,auVar42);
  auVar67 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar68);
  auVar43 = vsubps_avx(auVar228,auVar63);
  uVar143 = auVar43._0_4_;
  auVar69._4_4_ = uVar143;
  auVar69._0_4_ = uVar143;
  auVar69._8_4_ = uVar143;
  auVar69._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar46 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar74._0_4_ = auVar46._0_4_ * fVar136;
  auVar74._4_4_ = auVar46._4_4_ * fVar215;
  auVar74._8_4_ = auVar46._8_4_ * fVar205;
  auVar74._12_4_ = auVar46._12_4_ * fVar213;
  auVar42 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar42);
  auVar149 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar69);
  auVar61 = vsubps_avx512vl(auVar56,auVar63);
  uVar143 = auVar61._0_4_;
  auVar70._4_4_ = uVar143;
  auVar70._0_4_ = uVar143;
  auVar70._8_4_ = uVar143;
  auVar70._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar61,auVar61,0x55);
  auVar46 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar75._0_4_ = auVar46._0_4_ * fVar136;
  auVar75._4_4_ = auVar46._4_4_ * fVar215;
  auVar75._8_4_ = auVar46._8_4_ * fVar205;
  auVar75._12_4_ = auVar46._12_4_ * fVar213;
  auVar42 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar42);
  auVar150 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar70);
  auVar50 = vsubps_avx(auVar57,auVar63);
  uVar143 = auVar50._0_4_;
  auVar71._4_4_ = uVar143;
  auVar71._0_4_ = uVar143;
  auVar71._8_4_ = uVar143;
  auVar71._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar50,auVar50,0x55);
  auVar46 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar85._0_4_ = auVar46._0_4_ * fVar136;
  auVar85._4_4_ = auVar46._4_4_ * fVar215;
  auVar85._8_4_ = auVar46._8_4_ * fVar205;
  auVar85._12_4_ = auVar46._12_4_ * fVar213;
  auVar42 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar42);
  auVar156 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar71);
  auVar62 = vsubps_avx512vl(auVar53,auVar63);
  uVar143 = auVar62._0_4_;
  auVar44._4_4_ = uVar143;
  auVar44._0_4_ = uVar143;
  auVar44._8_4_ = uVar143;
  auVar44._12_4_ = uVar143;
  auVar42 = vshufps_avx(auVar62,auVar62,0x55);
  auVar46 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar64._0_4_ = auVar46._0_4_ * fVar136;
  auVar64._4_4_ = auVar46._4_4_ * fVar215;
  auVar64._8_4_ = auVar46._8_4_ * fVar205;
  auVar64._12_4_ = auVar46._12_4_ * fVar213;
  auVar42 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar42);
  auVar157 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar44);
  auVar5 = vmovlhps_avx(auVar47,auVar149);
  auVar51 = vmovlhps_avx(auVar65,auVar150);
  auVar44 = vmovlhps_avx512f(auVar66,auVar156);
  auVar45 = vmovlhps_avx512f(auVar67,auVar157);
  auVar46 = vminps_avx(auVar5,auVar51);
  auVar42 = vmaxps_avx(auVar5,auVar51);
  auVar63 = vminps_avx512vl(auVar44,auVar45);
  auVar46 = vminps_avx(auVar46,auVar63);
  auVar63 = vmaxps_avx512vl(auVar44,auVar45);
  auVar42 = vmaxps_avx(auVar42,auVar63);
  auVar63 = vshufpd_avx(auVar46,auVar46,3);
  auVar46 = vminps_avx(auVar46,auVar63);
  auVar63 = vshufpd_avx(auVar42,auVar42,3);
  auVar42 = vmaxps_avx(auVar42,auVar63);
  auVar46 = vandps_avx512vl(auVar46,auVar249._0_16_);
  auVar42 = vandps_avx512vl(auVar42,auVar249._0_16_);
  auVar42 = vmaxps_avx(auVar46,auVar42);
  auVar46 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar46,auVar42);
  local_350 = uVar36 + 0xff;
  fVar136 = auVar42._0_4_ * 9.536743e-07;
  auVar64 = vmovddup_avx512vl(auVar47);
  auVar65 = vmovddup_avx512vl(auVar65);
  auVar66 = vmovddup_avx512vl(auVar66);
  auVar144._8_8_ = auVar67._0_8_;
  auVar144._0_8_ = auVar67._0_8_;
  auVar95 = vbroadcastss_avx512vl(ZEXT416((uint)fVar136));
  auVar42 = vxorps_avx512vl(auVar95._0_16_,auVar250._0_16_);
  auVar97 = vbroadcastss_avx512vl(auVar42);
  uVar32 = 0;
  auVar42 = vsubps_avx(auVar51,auVar5);
  auVar118._0_16_ = vsubps_avx512vl(auVar44,auVar51);
  auVar67 = vsubps_avx512vl(auVar45,auVar44);
  auVar46 = vsubps_avx(auVar228,auVar48);
  auVar68 = vsubps_avx512vl(auVar56,auVar54);
  auVar69 = vsubps_avx512vl(auVar57,auVar55);
  auVar70 = vsubps_avx512vl(auVar53,auVar52);
  auVar71 = vpbroadcastd_avx512vl();
  auVar72 = vpbroadcastd_avx512vl();
  auVar63 = ZEXT816(0x3f80000000000000);
  auVar47 = auVar63;
LAB_01a2c35b:
  do {
    auVar76 = vshufps_avx(auVar47,auVar47,0x50);
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = 0x3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar240._16_4_ = 0x3f800000;
    auVar240._0_16_ = auVar237;
    auVar240._20_4_ = 0x3f800000;
    auVar240._24_4_ = 0x3f800000;
    auVar240._28_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar237,auVar76);
    fVar215 = auVar76._0_4_;
    fVar140 = auVar149._0_4_;
    auVar83._0_4_ = fVar140 * fVar215;
    fVar205 = auVar76._4_4_;
    fVar141 = auVar149._4_4_;
    auVar83._4_4_ = fVar141 * fVar205;
    fVar213 = auVar76._8_4_;
    auVar83._8_4_ = fVar140 * fVar213;
    fVar214 = auVar76._12_4_;
    auVar83._12_4_ = fVar141 * fVar214;
    fVar155 = auVar150._0_4_;
    auVar81._0_4_ = fVar155 * fVar215;
    fVar142 = auVar150._4_4_;
    auVar81._4_4_ = fVar142 * fVar205;
    auVar81._8_4_ = fVar155 * fVar213;
    auVar81._12_4_ = fVar142 * fVar214;
    fVar146 = auVar156._0_4_;
    auVar82._0_4_ = fVar146 * fVar215;
    fVar147 = auVar156._4_4_;
    auVar82._4_4_ = fVar147 * fVar205;
    auVar82._8_4_ = fVar146 * fVar213;
    auVar82._12_4_ = fVar147 * fVar214;
    fVar148 = auVar157._0_4_;
    auVar80._0_4_ = fVar148 * fVar215;
    fVar216 = auVar157._4_4_;
    auVar80._4_4_ = fVar216 * fVar205;
    auVar80._8_4_ = fVar148 * fVar213;
    auVar80._12_4_ = fVar216 * fVar214;
    auVar73 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar64);
    auVar74 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar65);
    auVar75 = vfmadd231ps_avx512vl(auVar82,auVar89,auVar66);
    auVar89 = vfmadd231ps_fma(auVar80,auVar144,auVar89);
    auVar76 = vmovshdup_avx(auVar63);
    fVar205 = auVar63._0_4_;
    fVar215 = (auVar76._0_4_ - fVar205) * 0.04761905;
    auVar188._4_4_ = fVar205;
    auVar188._0_4_ = fVar205;
    auVar188._8_4_ = fVar205;
    auVar188._12_4_ = fVar205;
    auVar188._16_4_ = fVar205;
    auVar188._20_4_ = fVar205;
    auVar188._24_4_ = fVar205;
    auVar188._28_4_ = fVar205;
    auVar162._0_8_ = auVar76._0_8_;
    auVar162._8_8_ = auVar162._0_8_;
    auVar162._16_8_ = auVar162._0_8_;
    auVar162._24_8_ = auVar162._0_8_;
    auVar96 = vsubps_avx(auVar162,auVar188);
    uVar143 = auVar73._0_4_;
    auVar163._4_4_ = uVar143;
    auVar163._0_4_ = uVar143;
    auVar163._8_4_ = uVar143;
    auVar163._12_4_ = uVar143;
    auVar163._16_4_ = uVar143;
    auVar163._20_4_ = uVar143;
    auVar163._24_4_ = uVar143;
    auVar163._28_4_ = uVar143;
    auVar202._8_4_ = 1;
    auVar202._0_8_ = 0x100000001;
    auVar202._12_4_ = 1;
    auVar202._16_4_ = 1;
    auVar202._20_4_ = 1;
    auVar202._24_4_ = 1;
    auVar202._28_4_ = 1;
    auVar98 = ZEXT1632(auVar73);
    auVar113 = vpermps_avx2(auVar202,auVar98);
    auVar103 = vbroadcastss_avx512vl(auVar74);
    auVar114 = ZEXT1632(auVar74);
    auVar104 = vpermps_avx512vl(auVar202,auVar114);
    auVar105 = vbroadcastss_avx512vl(auVar75);
    auVar109 = ZEXT1632(auVar75);
    auVar106 = vpermps_avx512vl(auVar202,auVar109);
    auVar93 = vbroadcastss_avx512vl(auVar89);
    auVar110 = ZEXT1632(auVar89);
    auVar94 = vpermps_avx512vl(auVar202,auVar110);
    auVar203._4_4_ = fVar215;
    auVar203._0_4_ = fVar215;
    auVar203._8_4_ = fVar215;
    auVar203._12_4_ = fVar215;
    auVar203._16_4_ = fVar215;
    auVar203._20_4_ = fVar215;
    auVar203._24_4_ = fVar215;
    auVar203._28_4_ = fVar215;
    auVar111 = auVar254._0_32_;
    auVar107 = vpermps_avx512vl(auVar111,auVar98);
    auVar183._8_4_ = 3;
    auVar183._0_8_ = 0x300000003;
    auVar183._12_4_ = 3;
    auVar183._16_4_ = 3;
    auVar183._20_4_ = 3;
    auVar183._24_4_ = 3;
    auVar183._28_4_ = 3;
    auVar91 = vpermps_avx512vl(auVar183,auVar98);
    auVar92 = vpermps_avx512vl(auVar111,auVar114);
    auVar98 = vpermps_avx2(auVar183,auVar114);
    auVar108 = vpermps_avx512vl(auVar111,auVar109);
    auVar114 = vpermps_avx2(auVar183,auVar109);
    auVar109 = vpermps_avx512vl(auVar111,auVar110);
    auVar110 = vpermps_avx512vl(auVar183,auVar110);
    auVar76 = vfmadd132ps_fma(auVar96,auVar188,_DAT_01f7b040);
    auVar96 = vsubps_avx(auVar240,ZEXT1632(auVar76));
    auVar111 = vmulps_avx512vl(auVar103,ZEXT1632(auVar76));
    auVar115 = ZEXT1632(auVar76);
    auVar112 = vmulps_avx512vl(auVar104,auVar115);
    auVar89 = vfmadd231ps_fma(auVar111,auVar96,auVar163);
    auVar73 = vfmadd231ps_fma(auVar112,auVar96,auVar113);
    auVar111 = vmulps_avx512vl(auVar105,auVar115);
    auVar112 = vmulps_avx512vl(auVar106,auVar115);
    auVar103 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar112,auVar96,auVar104);
    auVar111 = vmulps_avx512vl(auVar93,auVar115);
    auVar112 = ZEXT1632(auVar76);
    auVar94 = vmulps_avx512vl(auVar94,auVar112);
    auVar105 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar106);
    fVar213 = auVar76._0_4_;
    fVar214 = auVar76._4_4_;
    auVar16._4_4_ = fVar214 * auVar103._4_4_;
    auVar16._0_4_ = fVar213 * auVar103._0_4_;
    fVar224 = auVar76._8_4_;
    auVar16._8_4_ = fVar224 * auVar103._8_4_;
    fVar225 = auVar76._12_4_;
    auVar16._12_4_ = fVar225 * auVar103._12_4_;
    auVar16._16_4_ = auVar103._16_4_ * 0.0;
    auVar16._20_4_ = auVar103._20_4_ * 0.0;
    auVar16._24_4_ = auVar103._24_4_ * 0.0;
    auVar16._28_4_ = fVar205;
    auVar17._4_4_ = fVar214 * auVar104._4_4_;
    auVar17._0_4_ = fVar213 * auVar104._0_4_;
    auVar17._8_4_ = fVar224 * auVar104._8_4_;
    auVar17._12_4_ = fVar225 * auVar104._12_4_;
    auVar17._16_4_ = auVar104._16_4_ * 0.0;
    auVar17._20_4_ = auVar104._20_4_ * 0.0;
    auVar17._24_4_ = auVar104._24_4_ * 0.0;
    auVar17._28_4_ = auVar113._28_4_;
    auVar89 = vfmadd231ps_fma(auVar16,auVar96,ZEXT1632(auVar89));
    auVar73 = vfmadd231ps_fma(auVar17,auVar96,ZEXT1632(auVar73));
    auVar153._0_4_ = fVar213 * auVar105._0_4_;
    auVar153._4_4_ = fVar214 * auVar105._4_4_;
    auVar153._8_4_ = fVar224 * auVar105._8_4_;
    auVar153._12_4_ = fVar225 * auVar105._12_4_;
    auVar153._16_4_ = auVar105._16_4_ * 0.0;
    auVar153._20_4_ = auVar105._20_4_ * 0.0;
    auVar153._24_4_ = auVar105._24_4_ * 0.0;
    auVar153._28_4_ = 0;
    auVar18._4_4_ = fVar214 * auVar106._4_4_;
    auVar18._0_4_ = fVar213 * auVar106._0_4_;
    auVar18._8_4_ = fVar224 * auVar106._8_4_;
    auVar18._12_4_ = fVar225 * auVar106._12_4_;
    auVar18._16_4_ = auVar106._16_4_ * 0.0;
    auVar18._20_4_ = auVar106._20_4_ * 0.0;
    auVar18._24_4_ = auVar106._24_4_ * 0.0;
    auVar18._28_4_ = auVar105._28_4_;
    auVar74 = vfmadd231ps_fma(auVar153,auVar96,auVar103);
    auVar75 = vfmadd231ps_fma(auVar18,auVar96,auVar104);
    auVar19._28_4_ = auVar104._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * auVar75._12_4_,
                            CONCAT48(fVar224 * auVar75._8_4_,
                                     CONCAT44(fVar214 * auVar75._4_4_,fVar213 * auVar75._0_4_))));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar225 * auVar74._12_4_,
                                                 CONCAT48(fVar224 * auVar74._8_4_,
                                                          CONCAT44(fVar214 * auVar74._4_4_,
                                                                   fVar213 * auVar74._0_4_)))),
                              auVar96,ZEXT1632(auVar89));
    auVar88 = vfmadd231ps_fma(auVar19,auVar96,ZEXT1632(auVar73));
    auVar113 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar89));
    auVar103 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar73));
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar113 = vmulps_avx512vl(auVar113,auVar104);
    auVar103 = vmulps_avx512vl(auVar103,auVar104);
    auVar197._0_4_ = fVar215 * auVar113._0_4_;
    auVar197._4_4_ = fVar215 * auVar113._4_4_;
    auVar197._8_4_ = fVar215 * auVar113._8_4_;
    auVar197._12_4_ = fVar215 * auVar113._12_4_;
    auVar197._16_4_ = fVar215 * auVar113._16_4_;
    auVar197._20_4_ = fVar215 * auVar113._20_4_;
    auVar197._24_4_ = fVar215 * auVar113._24_4_;
    auVar197._28_4_ = 0;
    auVar113 = vmulps_avx512vl(auVar203,auVar103);
    auVar73 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
    auVar103 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar105 = vpermt2ps_avx512vl(ZEXT1632(auVar88),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar154._0_4_ = auVar197._0_4_ + auVar85._0_4_;
    auVar154._4_4_ = auVar197._4_4_ + auVar85._4_4_;
    auVar154._8_4_ = auVar197._8_4_ + auVar85._8_4_;
    auVar154._12_4_ = auVar197._12_4_ + auVar85._12_4_;
    auVar154._16_4_ = auVar197._16_4_ + 0.0;
    auVar154._20_4_ = auVar197._20_4_ + 0.0;
    auVar154._24_4_ = auVar197._24_4_ + 0.0;
    auVar154._28_4_ = 0;
    auVar115 = ZEXT1632(auVar73);
    auVar106 = vpermt2ps_avx512vl(auVar197,_DAT_01fb9fc0,auVar115);
    auVar93 = vaddps_avx512vl(ZEXT1632(auVar88),auVar113);
    auVar94 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar115);
    auVar113 = vsubps_avx(auVar103,auVar106);
    auVar106 = vsubps_avx512vl(auVar105,auVar94);
    auVar94 = vmulps_avx512vl(auVar92,auVar112);
    auVar111 = vmulps_avx512vl(auVar98,auVar112);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar91);
    auVar91 = vmulps_avx512vl(auVar108,auVar112);
    auVar111 = vmulps_avx512vl(auVar114,auVar112);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar98);
    auVar92 = vmulps_avx512vl(auVar109,auVar112);
    auVar109 = vmulps_avx512vl(auVar110,auVar112);
    auVar89 = vfmadd231ps_fma(auVar92,auVar96,auVar108);
    auVar92 = vfmadd231ps_avx512vl(auVar109,auVar96,auVar114);
    auVar108 = vmulps_avx512vl(auVar112,auVar91);
    auVar110 = ZEXT1632(auVar76);
    auVar109 = vmulps_avx512vl(auVar110,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar94);
    auVar107 = vfmadd231ps_avx512vl(auVar109,auVar96,auVar107);
    auVar92 = vmulps_avx512vl(auVar110,auVar92);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar225 * auVar89._12_4_,
                                            CONCAT48(fVar224 * auVar89._8_4_,
                                                     CONCAT44(fVar214 * auVar89._4_4_,
                                                              fVar213 * auVar89._0_4_)))),auVar96,
                         auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar98);
    auVar20._4_4_ = fVar214 * auVar91._4_4_;
    auVar20._0_4_ = fVar213 * auVar91._0_4_;
    auVar20._8_4_ = fVar224 * auVar91._8_4_;
    auVar20._12_4_ = fVar225 * auVar91._12_4_;
    auVar20._16_4_ = auVar91._16_4_ * 0.0;
    auVar20._20_4_ = auVar91._20_4_ * 0.0;
    auVar20._24_4_ = auVar91._24_4_ * 0.0;
    auVar20._28_4_ = auVar114._28_4_;
    auVar114 = vmulps_avx512vl(auVar110,auVar98);
    auVar92 = vfmadd231ps_avx512vl(auVar20,auVar96,auVar94);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,auVar96);
    auVar96 = vsubps_avx512vl(auVar91,auVar94);
    auVar98 = vsubps_avx512vl(auVar98,auVar107);
    auVar96 = vmulps_avx512vl(auVar96,auVar104);
    auVar98 = vmulps_avx512vl(auVar98,auVar104);
    fVar205 = fVar215 * auVar96._0_4_;
    fVar213 = fVar215 * auVar96._4_4_;
    auVar21._4_4_ = fVar213;
    auVar21._0_4_ = fVar205;
    fVar214 = fVar215 * auVar96._8_4_;
    auVar21._8_4_ = fVar214;
    fVar224 = fVar215 * auVar96._12_4_;
    auVar21._12_4_ = fVar224;
    fVar225 = fVar215 * auVar96._16_4_;
    auVar21._16_4_ = fVar225;
    fVar226 = fVar215 * auVar96._20_4_;
    auVar21._20_4_ = fVar226;
    fVar215 = fVar215 * auVar96._24_4_;
    auVar21._24_4_ = fVar215;
    auVar21._28_4_ = auVar96._28_4_;
    auVar98 = vmulps_avx512vl(auVar203,auVar98);
    auVar104 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,auVar115);
    auVar94 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar115);
    auVar204._0_4_ = auVar92._0_4_ + fVar205;
    auVar204._4_4_ = auVar92._4_4_ + fVar213;
    auVar204._8_4_ = auVar92._8_4_ + fVar214;
    auVar204._12_4_ = auVar92._12_4_ + fVar224;
    auVar204._16_4_ = auVar92._16_4_ + fVar225;
    auVar204._20_4_ = auVar92._20_4_ + fVar226;
    auVar204._24_4_ = auVar92._24_4_ + fVar215;
    auVar204._28_4_ = auVar92._28_4_ + auVar96._28_4_;
    auVar96 = vpermt2ps_avx512vl(auVar21,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar107 = vaddps_avx512vl(auVar114,auVar98);
    auVar246 = ZEXT3264(auVar107);
    auVar98 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar96 = vsubps_avx(auVar104,auVar96);
    auVar98 = vsubps_avx512vl(auVar94,auVar98);
    auVar165 = ZEXT1632(auVar85);
    auVar91 = vsubps_avx512vl(auVar92,auVar165);
    auVar171 = ZEXT1632(auVar88);
    auVar108 = vsubps_avx512vl(auVar114,auVar171);
    auVar109 = vsubps_avx512vl(auVar104,auVar103);
    auVar91 = vaddps_avx512vl(auVar91,auVar109);
    auVar109 = vsubps_avx512vl(auVar94,auVar105);
    auVar108 = vaddps_avx512vl(auVar108,auVar109);
    auVar109 = vmulps_avx512vl(auVar171,auVar91);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar165,auVar108);
    auVar110 = vmulps_avx512vl(auVar93,auVar91);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar154,auVar108);
    auVar111 = vmulps_avx512vl(auVar106,auVar91);
    auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar113,auVar108);
    auVar112 = vmulps_avx512vl(auVar105,auVar91);
    auVar112 = vfnmadd231ps_avx512vl(auVar112,auVar103,auVar108);
    auVar115 = vmulps_avx512vl(auVar114,auVar91);
    auVar115 = vfnmadd231ps_avx512vl(auVar115,auVar92,auVar108);
    auVar116 = vmulps_avx512vl(auVar107,auVar91);
    auVar116 = vfnmadd231ps_avx512vl(auVar116,auVar204,auVar108);
    auVar117 = vmulps_avx512vl(auVar98,auVar91);
    auVar117 = vfnmadd231ps_avx512vl(auVar117,auVar96,auVar108);
    auVar91 = vmulps_avx512vl(auVar94,auVar91);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar104,auVar108);
    auVar108 = vminps_avx512vl(auVar109,auVar110);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar110 = vminps_avx512vl(auVar111,auVar112);
    auVar108 = vminps_avx512vl(auVar108,auVar110);
    auVar110 = vmaxps_avx512vl(auVar111,auVar112);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar110 = vminps_avx512vl(auVar115,auVar116);
    auVar111 = vmaxps_avx512vl(auVar115,auVar116);
    auVar112 = vminps_avx512vl(auVar117,auVar91);
    auVar110 = vminps_avx512vl(auVar110,auVar112);
    auVar108 = vminps_avx512vl(auVar108,auVar110);
    auVar91 = vmaxps_avx512vl(auVar117,auVar91);
    auVar91 = vmaxps_avx512vl(auVar111,auVar91);
    auVar91 = vmaxps_avx512vl(auVar109,auVar91);
    uVar12 = vcmpps_avx512vl(auVar108,auVar95,2);
    uVar13 = vcmpps_avx512vl(auVar91,auVar97,5);
    bVar30 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar30 != 0) {
      auVar91 = vsubps_avx512vl(auVar103,auVar165);
      auVar108 = vsubps_avx512vl(auVar105,auVar171);
      auVar109 = vsubps_avx512vl(auVar104,auVar92);
      auVar91 = vaddps_avx512vl(auVar91,auVar109);
      auVar109 = vsubps_avx512vl(auVar94,auVar114);
      auVar108 = vaddps_avx512vl(auVar108,auVar109);
      auVar109 = vmulps_avx512vl(auVar171,auVar91);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar108,auVar165);
      auVar93 = vmulps_avx512vl(auVar93,auVar91);
      auVar93 = vfnmadd213ps_avx512vl(auVar154,auVar108,auVar93);
      auVar106 = vmulps_avx512vl(auVar106,auVar91);
      auVar106 = vfnmadd213ps_avx512vl(auVar113,auVar108,auVar106);
      auVar113 = vmulps_avx512vl(auVar105,auVar91);
      auVar105 = vfnmadd231ps_avx512vl(auVar113,auVar108,auVar103);
      auVar113 = vmulps_avx512vl(auVar114,auVar91);
      auVar114 = vfnmadd231ps_avx512vl(auVar113,auVar108,auVar92);
      auVar113 = vmulps_avx512vl(auVar107,auVar91);
      auVar107 = vfnmadd213ps_avx512vl(auVar204,auVar108,auVar113);
      auVar113 = vmulps_avx512vl(auVar98,auVar91);
      auVar92 = vfnmadd213ps_avx512vl(auVar96,auVar108,auVar113);
      auVar96 = vmulps_avx512vl(auVar94,auVar91);
      auVar104 = vfnmadd231ps_avx512vl(auVar96,auVar104,auVar108);
      auVar113 = vminps_avx(auVar109,auVar93);
      auVar96 = vmaxps_avx(auVar109,auVar93);
      auVar103 = vminps_avx(auVar106,auVar105);
      auVar103 = vminps_avx(auVar113,auVar103);
      auVar113 = vmaxps_avx(auVar106,auVar105);
      auVar96 = vmaxps_avx(auVar96,auVar113);
      auVar98 = vminps_avx(auVar114,auVar107);
      auVar113 = vmaxps_avx(auVar114,auVar107);
      auVar114 = vminps_avx(auVar92,auVar104);
      auVar98 = vminps_avx(auVar98,auVar114);
      auVar98 = vminps_avx(auVar103,auVar98);
      auVar103 = vmaxps_avx(auVar92,auVar104);
      auVar113 = vmaxps_avx(auVar113,auVar103);
      auVar96 = vmaxps_avx(auVar96,auVar113);
      uVar12 = vcmpps_avx512vl(auVar96,auVar97,5);
      uVar13 = vcmpps_avx512vl(auVar98,auVar95,2);
      bVar30 = bVar30 & (byte)uVar12 & (byte)uVar13;
      if (bVar30 != 0) {
        mask_stack[uVar32] = (uint)bVar30;
        BVar2 = (BBox1f)vmovlps_avx(auVar63);
        cu_stack[uVar32] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar47);
        cv_stack[uVar32] = BVar2;
        uVar32 = (ulong)((int)uVar32 + 1);
      }
    }
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar247 = ZEXT1664(auVar63);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar63);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar250 = ZEXT1664(auVar63);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar248 = ZEXT3264(auVar96);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar251 = ZEXT1664(auVar63);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar252 = ZEXT1664(auVar63);
    auVar253 = ZEXT3264(_DAT_01fb9fe0);
    auVar118._16_16_ = DAT_01fb9fe0._16_16_;
    auVar96 = auVar118;
LAB_01a2c859:
    do {
      do {
        do {
          if ((int)uVar32 == 0) {
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar15._4_4_ = uVar143;
            auVar15._0_4_ = uVar143;
            auVar15._8_4_ = uVar143;
            auVar15._12_4_ = uVar143;
            auVar15._16_4_ = uVar143;
            auVar15._20_4_ = uVar143;
            auVar15._24_4_ = uVar143;
            auVar15._28_4_ = uVar143;
            uVar12 = vcmpps_avx512vl(local_78,auVar15,2);
            uVar36 = (ulong)((uint)uVar36 & (uint)local_350 & (uint)uVar12);
            goto LAB_01a2bc4e;
          }
          uVar31 = (int)uVar32 - 1;
          uVar135 = mask_stack[uVar31];
          auVar47._8_8_ = 0;
          auVar47._0_4_ = cv_stack[uVar31].lower;
          auVar47._4_4_ = cv_stack[uVar31].upper;
          uVar41 = 0;
          for (uVar35 = (ulong)uVar135; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
              ) {
            uVar41 = uVar41 + 1;
          }
          uVar34 = uVar135 - 1 & uVar135;
          bVar39 = uVar34 == 0;
          mask_stack[uVar31] = uVar34;
          if (bVar39) {
            uVar32 = (ulong)uVar31;
          }
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar41;
          auVar63 = vpunpcklqdq_avx(auVar84,ZEXT416((int)uVar41 + 1));
          auVar63 = vcvtqq2ps_avx512vl(auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar251._0_16_);
          fVar215 = cu_stack[uVar31].upper;
          auVar77._4_4_ = fVar215;
          auVar77._0_4_ = fVar215;
          auVar77._8_4_ = fVar215;
          auVar77._12_4_ = fVar215;
          auVar76 = vmulps_avx512vl(auVar63,auVar77);
          auVar89 = auVar252._0_16_;
          auVar63 = vsubps_avx512vl(auVar89,auVar63);
          fVar215 = cu_stack[uVar31].lower;
          auVar78._4_4_ = fVar215;
          auVar78._0_4_ = fVar215;
          auVar78._8_4_ = fVar215;
          auVar78._12_4_ = fVar215;
          auVar63 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar78);
          auVar76 = vmovshdup_avx(auVar63);
          fVar215 = auVar76._0_4_ - auVar63._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          if (uVar135 == 0 || bVar39) goto LAB_01a2c35b;
          auVar76 = vshufps_avx(auVar47,auVar47,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          auVar75 = vsubps_avx512vl(auVar89,auVar76);
          fVar205 = auVar76._0_4_;
          auVar87._0_4_ = fVar205 * fVar140;
          fVar213 = auVar76._4_4_;
          auVar87._4_4_ = fVar213 * fVar141;
          fVar214 = auVar76._8_4_;
          auVar87._8_4_ = fVar214 * fVar140;
          fVar224 = auVar76._12_4_;
          auVar87._12_4_ = fVar224 * fVar141;
          auVar174._0_4_ = fVar205 * fVar155;
          auVar174._4_4_ = fVar213 * fVar142;
          auVar174._8_4_ = fVar214 * fVar155;
          auVar174._12_4_ = fVar224 * fVar142;
          auVar179._0_4_ = fVar205 * fVar146;
          auVar179._4_4_ = fVar213 * fVar147;
          auVar179._8_4_ = fVar214 * fVar146;
          auVar179._12_4_ = fVar224 * fVar147;
          auVar86._0_4_ = fVar205 * fVar148;
          auVar86._4_4_ = fVar213 * fVar216;
          auVar86._8_4_ = fVar214 * fVar148;
          auVar86._12_4_ = fVar224 * fVar216;
          auVar76 = vfmadd231ps_fma(auVar87,auVar75,auVar64);
          auVar73 = vfmadd231ps_fma(auVar174,auVar75,auVar65);
          auVar74 = vfmadd231ps_fma(auVar179,auVar75,auVar66);
          auVar75 = vfmadd231ps_fma(auVar86,auVar75,auVar144);
          auVar166._16_16_ = auVar76;
          auVar166._0_16_ = auVar76;
          auVar172._16_16_ = auVar73;
          auVar172._0_16_ = auVar73;
          auVar178._16_16_ = auVar74;
          auVar178._0_16_ = auVar74;
          auVar113 = vpermps_avx512vl(auVar253._0_32_,ZEXT1632(auVar63));
          auVar96 = vsubps_avx(auVar172,auVar166);
          auVar73 = vfmadd213ps_fma(auVar96,auVar113,auVar166);
          auVar96 = vsubps_avx(auVar178,auVar172);
          auVar85 = vfmadd213ps_fma(auVar96,auVar113,auVar172);
          auVar76 = vsubps_avx(auVar75,auVar74);
          auVar173._16_16_ = auVar76;
          auVar173._0_16_ = auVar76;
          auVar76 = vfmadd213ps_fma(auVar173,auVar113,auVar178);
          auVar96 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar73));
          auVar73 = vfmadd213ps_fma(auVar96,auVar113,ZEXT1632(auVar73));
          auVar96 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar85));
          auVar76 = vfmadd213ps_fma(auVar96,auVar113,ZEXT1632(auVar85));
          auVar96 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar73));
          auVar237 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar96,auVar113);
          auVar96 = vmulps_avx512vl(auVar96,auVar248._0_32_);
          fVar205 = fVar215 * 0.33333334;
          auVar180._0_8_ =
               CONCAT44(auVar237._4_4_ + fVar205 * auVar96._4_4_,
                        auVar237._0_4_ + fVar205 * auVar96._0_4_);
          auVar180._8_4_ = auVar237._8_4_ + fVar205 * auVar96._8_4_;
          auVar180._12_4_ = auVar237._12_4_ + fVar205 * auVar96._12_4_;
          auVar167._0_4_ = fVar205 * auVar96._16_4_;
          auVar167._4_4_ = fVar205 * auVar96._20_4_;
          auVar167._8_4_ = fVar205 * auVar96._24_4_;
          auVar167._12_4_ = fVar205 * auVar96._28_4_;
          auVar83 = vsubps_avx((undefined1  [16])0x0,auVar167);
          auVar85 = vshufpd_avx(auVar237,auVar237,3);
          auVar88 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar76 = vsubps_avx(auVar85,auVar237);
          auVar73 = vsubps_avx(auVar88,(undefined1  [16])0x0);
          auVar189._0_4_ = auVar76._0_4_ + auVar73._0_4_;
          auVar189._4_4_ = auVar76._4_4_ + auVar73._4_4_;
          auVar189._8_4_ = auVar76._8_4_ + auVar73._8_4_;
          auVar189._12_4_ = auVar76._12_4_ + auVar73._12_4_;
          auVar76 = vshufps_avx(auVar237,auVar237,0xb1);
          auVar73 = vshufps_avx(auVar180,auVar180,0xb1);
          auVar74 = vshufps_avx(auVar83,auVar83,0xb1);
          auVar75 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar238._4_4_ = auVar189._0_4_;
          auVar238._0_4_ = auVar189._0_4_;
          auVar238._8_4_ = auVar189._0_4_;
          auVar238._12_4_ = auVar189._0_4_;
          auVar79 = vshufps_avx(auVar189,auVar189,0x55);
          fVar205 = auVar79._0_4_;
          auVar198._0_4_ = auVar76._0_4_ * fVar205;
          fVar213 = auVar79._4_4_;
          auVar198._4_4_ = auVar76._4_4_ * fVar213;
          fVar214 = auVar79._8_4_;
          auVar198._8_4_ = auVar76._8_4_ * fVar214;
          fVar224 = auVar79._12_4_;
          auVar198._12_4_ = auVar76._12_4_ * fVar224;
          auVar206._0_4_ = auVar73._0_4_ * fVar205;
          auVar206._4_4_ = auVar73._4_4_ * fVar213;
          auVar206._8_4_ = auVar73._8_4_ * fVar214;
          auVar206._12_4_ = auVar73._12_4_ * fVar224;
          auVar217._0_4_ = auVar74._0_4_ * fVar205;
          auVar217._4_4_ = auVar74._4_4_ * fVar213;
          auVar217._8_4_ = auVar74._8_4_ * fVar214;
          auVar217._12_4_ = auVar74._12_4_ * fVar224;
          auVar190._0_4_ = auVar75._0_4_ * fVar205;
          auVar190._4_4_ = auVar75._4_4_ * fVar213;
          auVar190._8_4_ = auVar75._8_4_ * fVar214;
          auVar190._12_4_ = auVar75._12_4_ * fVar224;
          auVar76 = vfmadd231ps_fma(auVar198,auVar238,auVar237);
          auVar73 = vfmadd231ps_fma(auVar206,auVar238,auVar180);
          auVar81 = vfmadd231ps_fma(auVar217,auVar238,auVar83);
          auVar82 = vfmadd231ps_fma(auVar190,(undefined1  [16])0x0,auVar238);
          auVar79 = vshufpd_avx(auVar76,auVar76,1);
          auVar80 = vshufpd_avx(auVar73,auVar73,1);
          auVar77 = vshufpd_avx512vl(auVar81,auVar81,1);
          auVar78 = vshufpd_avx512vl(auVar82,auVar82,1);
          auVar74 = vminss_avx(auVar76,auVar73);
          auVar76 = vmaxss_avx(auVar73,auVar76);
          auVar75 = vminss_avx(auVar81,auVar82);
          auVar73 = vmaxss_avx(auVar82,auVar81);
          auVar74 = vminss_avx(auVar74,auVar75);
          auVar76 = vmaxss_avx(auVar73,auVar76);
          auVar75 = vminss_avx(auVar79,auVar80);
          auVar73 = vmaxss_avx(auVar80,auVar79);
          auVar79 = vminss_avx512f(auVar77,auVar78);
          auVar80 = vmaxss_avx512f(auVar78,auVar77);
          auVar73 = vmaxss_avx(auVar80,auVar73);
          auVar96._0_16_ = vminss_avx512f(auVar75,auVar79);
          auVar246 = ZEXT1664(auVar96._0_16_);
          fVar213 = auVar73._0_4_;
          fVar205 = auVar76._0_4_;
          if (auVar74._0_4_ < 0.0001) {
            bVar40 = fVar213 == -0.0001;
            bVar37 = NAN(fVar213);
            if (fVar213 <= -0.0001) goto LAB_01a2ca88;
            break;
          }
LAB_01a2ca88:
          vucomiss_avx512f(auVar96._0_16_);
          bVar40 = fVar213 <= -0.0001;
          bVar38 = -0.0001 < fVar205;
          bVar37 = bVar40;
          if (!bVar40) break;
          uVar12 = vcmpps_avx512vl(auVar74,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar13 = vcmpps_avx512vl(auVar96._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar31 = (uint)uVar12 & (uint)uVar13;
          bVar26 = (uVar31 & 1) == 0;
          bVar40 = bVar38 && bVar26;
          bVar37 = bVar38 && (uVar31 & 1) == 0;
        } while (!bVar38 || !bVar26);
        auVar80 = auVar255._0_16_;
        vcmpss_avx512f(auVar74,auVar80,1);
        uVar12 = vcmpss_avx512f(auVar76,auVar80,1);
        bVar38 = (bool)((byte)uVar12 & 1);
        auVar120._16_16_ = auVar96._16_16_;
        auVar120._0_16_ = auVar256._0_16_;
        auVar119._4_28_ = auVar120._4_28_;
        auVar119._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar256._0_4_);
        vucomiss_avx512f(auVar119._0_16_);
        bVar37 = (bool)(!bVar40 | bVar37);
        bVar38 = bVar37 == false;
        auVar122._16_16_ = auVar96._16_16_;
        auVar122._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar121._4_28_ = auVar122._4_28_;
        auVar121._0_4_ = (uint)bVar37 * auVar255._0_4_ + (uint)!bVar37 * 0x7f800000;
        auVar79 = auVar121._0_16_;
        auVar124._16_16_ = auVar96._16_16_;
        auVar124._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar123._4_28_ = auVar124._4_28_;
        auVar123._0_4_ = (uint)bVar37 * auVar255._0_4_ + (uint)!bVar37 * -0x800000;
        auVar75 = auVar123._0_16_;
        uVar12 = vcmpss_avx512f(auVar96._0_16_,auVar80,1);
        bVar40 = (bool)((byte)uVar12 & 1);
        auVar126._16_16_ = auVar96._16_16_;
        auVar126._0_16_ = auVar256._0_16_;
        auVar125._4_28_ = auVar126._4_28_;
        auVar125._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar256._0_4_);
        vucomiss_avx512f(auVar125._0_16_);
        if ((bVar37) || (bVar38)) {
          auVar81 = vucomiss_avx512f(auVar74);
          if ((bVar37) || (bVar38)) {
            auVar82 = vxorps_avx512vl(auVar74,auVar250._0_16_);
            auVar74 = vsubss_avx512f(auVar81,auVar74);
            auVar74 = vdivss_avx512f(auVar82,auVar74);
            auVar81 = vsubss_avx512f(ZEXT416(0x3f800000),auVar74);
            auVar74 = vfmadd213ss_avx512f(auVar81,auVar80,auVar74);
            auVar246 = ZEXT1664(auVar74);
          }
          else {
            auVar74 = vxorps_avx512vl(auVar81,auVar81);
            auVar246 = ZEXT1664(auVar74);
            vucomiss_avx512f(auVar74);
            auVar74 = ZEXT416(0x3f800000);
            if ((bVar37) || (bVar38)) {
              auVar246 = ZEXT464(0x7f800000);
              auVar74 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar79 = vminss_avx512f(auVar79,auVar246._0_16_);
          auVar75 = vmaxss_avx(auVar74,auVar75);
        }
        auVar256 = ZEXT464(0x3f800000);
        uVar12 = vcmpss_avx512f(auVar73,auVar80,1);
        bVar40 = (bool)((byte)uVar12 & 1);
        auVar73 = auVar256._0_16_;
        fVar214 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * 0x3f800000);
        if ((auVar119._0_4_ != fVar214) || (NAN(auVar119._0_4_) || NAN(fVar214))) {
          if ((fVar213 != fVar205) || (NAN(fVar213) || NAN(fVar205))) {
            auVar76 = vxorps_avx512vl(auVar76,auVar250._0_16_);
            auVar191._0_4_ = auVar76._0_4_ / (fVar213 - fVar205);
            auVar191._4_12_ = auVar76._4_12_;
            auVar76 = vsubss_avx512f(auVar73,auVar191);
            auVar76 = vfmadd213ss_avx512f(auVar76,auVar80,auVar191);
            auVar74 = auVar76;
          }
          else if ((fVar205 != 0.0) ||
                  (auVar76 = auVar73, auVar74 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar205))) {
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            auVar74 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar79 = vminss_avx(auVar79,auVar74);
          auVar75 = vmaxss_avx(auVar76,auVar75);
        }
        bVar40 = auVar125._0_4_ != fVar214;
        auVar76 = vminss_avx512f(auVar79,auVar73);
        auVar128._16_16_ = auVar96._16_16_;
        auVar128._0_16_ = auVar79;
        auVar127._4_28_ = auVar128._4_28_;
        auVar127._0_4_ = (uint)bVar40 * auVar76._0_4_ + (uint)!bVar40 * auVar79._0_4_;
        auVar76 = vmaxss_avx512f(auVar73,auVar75);
        auVar130._16_16_ = auVar96._16_16_;
        auVar130._0_16_ = auVar75;
        auVar129._4_28_ = auVar130._4_28_;
        auVar129._0_4_ = (uint)bVar40 * auVar76._0_4_ + (uint)!bVar40 * auVar75._0_4_;
        auVar76 = vmaxss_avx512f(auVar80,auVar127._0_16_);
        auVar96._0_16_ = vminss_avx512f(auVar129._0_16_,auVar73);
      } while (auVar96._0_4_ < auVar76._0_4_);
      auVar81 = vmaxss_avx512f(auVar80,ZEXT416((uint)(auVar76._0_4_ + -0.1)));
      auVar82 = vminss_avx512f(ZEXT416((uint)(auVar96._0_4_ + 0.1)),auVar73);
      auVar158._0_8_ = auVar237._0_8_;
      auVar158._8_8_ = auVar158._0_8_;
      auVar207._8_8_ = auVar180._0_8_;
      auVar207._0_8_ = auVar180._0_8_;
      auVar218._8_8_ = auVar83._0_8_;
      auVar218._0_8_ = auVar83._0_8_;
      auVar76 = vshufpd_avx(auVar180,auVar180,3);
      auVar74 = vshufpd_avx(auVar83,auVar83,3);
      auVar75 = vshufps_avx(auVar81,auVar82,0);
      auVar80 = vsubps_avx512vl(auVar89,auVar75);
      fVar205 = auVar75._0_4_;
      auVar175._0_4_ = fVar205 * auVar85._0_4_;
      fVar213 = auVar75._4_4_;
      auVar175._4_4_ = fVar213 * auVar85._4_4_;
      fVar214 = auVar75._8_4_;
      auVar175._8_4_ = fVar214 * auVar85._8_4_;
      fVar224 = auVar75._12_4_;
      auVar175._12_4_ = fVar224 * auVar85._12_4_;
      auVar181._0_4_ = fVar205 * auVar76._0_4_;
      auVar181._4_4_ = fVar213 * auVar76._4_4_;
      auVar181._8_4_ = fVar214 * auVar76._8_4_;
      auVar181._12_4_ = fVar224 * auVar76._12_4_;
      auVar241._0_4_ = auVar74._0_4_ * fVar205;
      auVar241._4_4_ = auVar74._4_4_ * fVar213;
      auVar241._8_4_ = auVar74._8_4_ * fVar214;
      auVar241._12_4_ = auVar74._12_4_ * fVar224;
      auVar168._0_4_ = fVar205 * auVar88._0_4_;
      auVar168._4_4_ = fVar213 * auVar88._4_4_;
      auVar168._8_4_ = fVar214 * auVar88._8_4_;
      auVar168._12_4_ = fVar224 * auVar88._12_4_;
      auVar85 = vfmadd231ps_fma(auVar175,auVar80,auVar158);
      auVar88 = vfmadd231ps_fma(auVar181,auVar80,auVar207);
      auVar79 = vfmadd231ps_fma(auVar241,auVar80,auVar218);
      auVar80 = vfmadd231ps_fma(auVar168,auVar80,ZEXT816(0));
      auVar74 = vsubss_avx512f(auVar73,auVar81);
      auVar76 = vmovshdup_avx(auVar47);
      auVar237 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar81._0_4_)),auVar47,auVar74);
      auVar74 = vsubss_avx512f(auVar73,auVar82);
      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_)),auVar47,auVar74);
      auVar83 = vdivss_avx512f(auVar73,ZEXT416((uint)fVar215));
      auVar47 = vsubps_avx(auVar88,auVar85);
      auVar167 = auVar247._0_16_;
      auVar74 = vmulps_avx512vl(auVar47,auVar167);
      auVar47 = vsubps_avx(auVar79,auVar88);
      auVar75 = vmulps_avx512vl(auVar47,auVar167);
      auVar47 = vsubps_avx(auVar80,auVar79);
      auVar47 = vmulps_avx512vl(auVar47,auVar167);
      auVar76 = vminps_avx(auVar75,auVar47);
      auVar47 = vmaxps_avx(auVar75,auVar47);
      auVar76 = vminps_avx(auVar74,auVar76);
      auVar47 = vmaxps_avx(auVar74,auVar47);
      auVar74 = vshufpd_avx(auVar76,auVar76,3);
      auVar75 = vshufpd_avx(auVar47,auVar47,3);
      auVar76 = vminps_avx(auVar76,auVar74);
      auVar47 = vmaxps_avx(auVar47,auVar75);
      fVar215 = auVar83._0_4_;
      auVar192._0_4_ = auVar76._0_4_ * fVar215;
      auVar192._4_4_ = auVar76._4_4_ * fVar215;
      auVar192._8_4_ = auVar76._8_4_ * fVar215;
      auVar192._12_4_ = auVar76._12_4_ * fVar215;
      auVar184._0_4_ = fVar215 * auVar47._0_4_;
      auVar184._4_4_ = fVar215 * auVar47._4_4_;
      auVar184._8_4_ = fVar215 * auVar47._8_4_;
      auVar184._12_4_ = fVar215 * auVar47._12_4_;
      auVar83 = vdivss_avx512f(auVar73,ZEXT416((uint)(auVar77._0_4_ - auVar237._0_4_)));
      auVar47 = vshufpd_avx(auVar85,auVar85,3);
      auVar76 = vshufpd_avx(auVar88,auVar88,3);
      auVar74 = vshufpd_avx(auVar79,auVar79,3);
      auVar75 = vshufpd_avx(auVar80,auVar80,3);
      auVar47 = vsubps_avx(auVar47,auVar85);
      auVar85 = vsubps_avx(auVar76,auVar88);
      auVar88 = vsubps_avx(auVar74,auVar79);
      auVar75 = vsubps_avx(auVar75,auVar80);
      auVar76 = vminps_avx(auVar47,auVar85);
      auVar47 = vmaxps_avx(auVar47,auVar85);
      auVar74 = vminps_avx(auVar88,auVar75);
      auVar74 = vminps_avx(auVar76,auVar74);
      auVar76 = vmaxps_avx(auVar88,auVar75);
      auVar47 = vmaxps_avx(auVar47,auVar76);
      fVar215 = auVar83._0_4_;
      auVar219._0_4_ = fVar215 * auVar74._0_4_;
      auVar219._4_4_ = fVar215 * auVar74._4_4_;
      auVar219._8_4_ = fVar215 * auVar74._8_4_;
      auVar219._12_4_ = fVar215 * auVar74._12_4_;
      auVar208._0_4_ = fVar215 * auVar47._0_4_;
      auVar208._4_4_ = fVar215 * auVar47._4_4_;
      auVar208._8_4_ = fVar215 * auVar47._8_4_;
      auVar208._12_4_ = fVar215 * auVar47._12_4_;
      auVar75 = vinsertps_avx(auVar63,auVar237,0x10);
      auVar78 = vpermt2ps_avx512vl(auVar63,_DAT_01fb9f90,auVar77);
      auVar145._0_4_ = auVar75._0_4_ + auVar78._0_4_;
      auVar145._4_4_ = auVar75._4_4_ + auVar78._4_4_;
      auVar145._8_4_ = auVar75._8_4_ + auVar78._8_4_;
      auVar145._12_4_ = auVar75._12_4_ + auVar78._12_4_;
      auVar14._8_4_ = 0x3f000000;
      auVar14._0_8_ = 0x3f0000003f000000;
      auVar14._12_4_ = 0x3f000000;
      auVar83 = vmulps_avx512vl(auVar145,auVar14);
      auVar76 = vshufps_avx(auVar83,auVar83,0x54);
      uVar143 = auVar83._0_4_;
      auVar151._4_4_ = uVar143;
      auVar151._0_4_ = uVar143;
      auVar151._8_4_ = uVar143;
      auVar151._12_4_ = uVar143;
      auVar74 = vfmadd213ps_fma(auVar42,auVar151,auVar5);
      auVar85 = vfmadd213ps_fma(auVar118._0_16_,auVar151,auVar51);
      auVar88 = vfmadd213ps_fma(auVar67,auVar151,auVar44);
      auVar47 = vsubps_avx(auVar85,auVar74);
      auVar74 = vfmadd213ps_fma(auVar47,auVar151,auVar74);
      auVar47 = vsubps_avx(auVar88,auVar85);
      auVar47 = vfmadd213ps_fma(auVar47,auVar151,auVar85);
      auVar47 = vsubps_avx(auVar47,auVar74);
      auVar74 = vfmadd231ps_fma(auVar74,auVar47,auVar151);
      auVar79 = vmulps_avx512vl(auVar47,auVar167);
      auVar229._8_8_ = auVar74._0_8_;
      auVar229._0_8_ = auVar74._0_8_;
      auVar47 = vshufpd_avx(auVar74,auVar74,3);
      auVar74 = vshufps_avx(auVar83,auVar83,0x55);
      auVar85 = vsubps_avx(auVar47,auVar229);
      auVar88 = vfmadd231ps_fma(auVar229,auVar74,auVar85);
      auVar242._8_8_ = auVar79._0_8_;
      auVar242._0_8_ = auVar79._0_8_;
      auVar47 = vshufpd_avx(auVar79,auVar79,3);
      auVar47 = vsubps_avx512vl(auVar47,auVar242);
      auVar47 = vfmadd213ps_avx512vl(auVar47,auVar74,auVar242);
      auVar152._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
      auVar152._8_4_ = auVar85._8_4_ ^ 0x80000000;
      auVar152._12_4_ = auVar85._12_4_ ^ 0x80000000;
      auVar74 = vmovshdup_avx512vl(auVar47);
      auVar243._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar243._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar243._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar79 = vmovshdup_avx512vl(auVar85);
      auVar80 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar85);
      auVar84 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar255 = ZEXT1664(auVar84);
      auVar74 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar74._0_4_ * auVar85._0_4_)),auVar47,auVar79);
      auVar85 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar152);
      auVar169._0_4_ = auVar74._0_4_;
      auVar169._4_4_ = auVar169._0_4_;
      auVar169._8_4_ = auVar169._0_4_;
      auVar169._12_4_ = auVar169._0_4_;
      auVar47 = vdivps_avx(auVar80,auVar169);
      auVar86 = vdivps_avx512vl(auVar85,auVar169);
      fVar215 = auVar88._0_4_;
      auVar74 = vshufps_avx(auVar88,auVar88,0x55);
      auVar230._0_4_ = fVar215 * auVar47._0_4_ + auVar74._0_4_ * auVar86._0_4_;
      auVar230._4_4_ = fVar215 * auVar47._4_4_ + auVar74._4_4_ * auVar86._4_4_;
      auVar230._8_4_ = fVar215 * auVar47._8_4_ + auVar74._8_4_ * auVar86._8_4_;
      auVar230._12_4_ = fVar215 * auVar47._12_4_ + auVar74._12_4_ * auVar86._12_4_;
      auVar81 = vsubps_avx(auVar76,auVar230);
      auVar74 = vmovshdup_avx(auVar47);
      auVar76 = vinsertps_avx(auVar192,auVar219,0x1c);
      auVar244._0_4_ = auVar74._0_4_ * auVar76._0_4_;
      auVar244._4_4_ = auVar74._4_4_ * auVar76._4_4_;
      auVar244._8_4_ = auVar74._8_4_ * auVar76._8_4_;
      auVar244._12_4_ = auVar74._12_4_ * auVar76._12_4_;
      auVar82 = vinsertps_avx512f(auVar184,auVar208,0x1c);
      auVar74 = vmulps_avx512vl(auVar74,auVar82);
      auVar80 = vminps_avx512vl(auVar244,auVar74);
      auVar88 = vmaxps_avx(auVar74,auVar244);
      auVar79 = vmovshdup_avx(auVar86);
      auVar74 = vinsertps_avx(auVar219,auVar192,0x4c);
      auVar220._0_4_ = auVar79._0_4_ * auVar74._0_4_;
      auVar220._4_4_ = auVar79._4_4_ * auVar74._4_4_;
      auVar220._8_4_ = auVar79._8_4_ * auVar74._8_4_;
      auVar220._12_4_ = auVar79._12_4_ * auVar74._12_4_;
      auVar85 = vinsertps_avx(auVar208,auVar184,0x4c);
      auVar209._0_4_ = auVar79._0_4_ * auVar85._0_4_;
      auVar209._4_4_ = auVar79._4_4_ * auVar85._4_4_;
      auVar209._8_4_ = auVar79._8_4_ * auVar85._8_4_;
      auVar209._12_4_ = auVar79._12_4_ * auVar85._12_4_;
      auVar79 = vminps_avx(auVar220,auVar209);
      auVar80 = vaddps_avx512vl(auVar80,auVar79);
      auVar79 = vmaxps_avx(auVar209,auVar220);
      auVar210._0_4_ = auVar88._0_4_ + auVar79._0_4_;
      auVar210._4_4_ = auVar88._4_4_ + auVar79._4_4_;
      auVar210._8_4_ = auVar88._8_4_ + auVar79._8_4_;
      auVar210._12_4_ = auVar88._12_4_ + auVar79._12_4_;
      auVar221._8_8_ = 0x3f80000000000000;
      auVar221._0_8_ = 0x3f80000000000000;
      auVar88 = vsubps_avx(auVar221,auVar210);
      auVar79 = vsubps_avx(auVar221,auVar80);
      auVar80 = vsubps_avx(auVar75,auVar83);
      auVar83 = vsubps_avx(auVar78,auVar83);
      fVar224 = auVar80._0_4_;
      auVar245._0_4_ = fVar224 * auVar88._0_4_;
      fVar225 = auVar80._4_4_;
      auVar245._4_4_ = fVar225 * auVar88._4_4_;
      fVar226 = auVar80._8_4_;
      auVar245._8_4_ = fVar226 * auVar88._8_4_;
      fVar227 = auVar80._12_4_;
      auVar245._12_4_ = fVar227 * auVar88._12_4_;
      auVar87 = vbroadcastss_avx512vl(auVar47);
      auVar76 = vmulps_avx512vl(auVar87,auVar76);
      auVar82 = vmulps_avx512vl(auVar87,auVar82);
      auVar87 = vminps_avx512vl(auVar76,auVar82);
      auVar82 = vmaxps_avx512vl(auVar82,auVar76);
      auVar76 = vbroadcastss_avx512vl(auVar86);
      auVar74 = vmulps_avx512vl(auVar76,auVar74);
      auVar76 = vmulps_avx512vl(auVar76,auVar85);
      auVar85 = vminps_avx512vl(auVar74,auVar76);
      auVar85 = vaddps_avx512vl(auVar87,auVar85);
      auVar80 = vmulps_avx512vl(auVar80,auVar79);
      fVar215 = auVar83._0_4_;
      auVar211._0_4_ = fVar215 * auVar88._0_4_;
      fVar205 = auVar83._4_4_;
      auVar211._4_4_ = fVar205 * auVar88._4_4_;
      fVar213 = auVar83._8_4_;
      auVar211._8_4_ = fVar213 * auVar88._8_4_;
      fVar214 = auVar83._12_4_;
      auVar211._12_4_ = fVar214 * auVar88._12_4_;
      auVar222._0_4_ = fVar215 * auVar79._0_4_;
      auVar222._4_4_ = fVar205 * auVar79._4_4_;
      auVar222._8_4_ = fVar213 * auVar79._8_4_;
      auVar222._12_4_ = fVar214 * auVar79._12_4_;
      auVar76 = vmaxps_avx(auVar76,auVar74);
      auVar185._0_4_ = auVar82._0_4_ + auVar76._0_4_;
      auVar185._4_4_ = auVar82._4_4_ + auVar76._4_4_;
      auVar185._8_4_ = auVar82._8_4_ + auVar76._8_4_;
      auVar185._12_4_ = auVar82._12_4_ + auVar76._12_4_;
      auVar193._8_8_ = 0x3f800000;
      auVar193._0_8_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar193,auVar185);
      auVar74 = vsubps_avx512vl(auVar193,auVar85);
      auVar239._0_4_ = fVar224 * auVar76._0_4_;
      auVar239._4_4_ = fVar225 * auVar76._4_4_;
      auVar239._8_4_ = fVar226 * auVar76._8_4_;
      auVar239._12_4_ = fVar227 * auVar76._12_4_;
      auVar231._0_4_ = fVar224 * auVar74._0_4_;
      auVar231._4_4_ = fVar225 * auVar74._4_4_;
      auVar231._8_4_ = fVar226 * auVar74._8_4_;
      auVar231._12_4_ = fVar227 * auVar74._12_4_;
      auVar186._0_4_ = fVar215 * auVar76._0_4_;
      auVar186._4_4_ = fVar205 * auVar76._4_4_;
      auVar186._8_4_ = fVar213 * auVar76._8_4_;
      auVar186._12_4_ = fVar214 * auVar76._12_4_;
      auVar194._0_4_ = fVar215 * auVar74._0_4_;
      auVar194._4_4_ = fVar205 * auVar74._4_4_;
      auVar194._8_4_ = fVar213 * auVar74._8_4_;
      auVar194._12_4_ = fVar214 * auVar74._12_4_;
      auVar76 = vminps_avx(auVar239,auVar231);
      auVar74 = vminps_avx512vl(auVar186,auVar194);
      auVar246 = ZEXT1664(auVar74);
      auVar85 = vminps_avx512vl(auVar76,auVar74);
      auVar76 = vmaxps_avx(auVar231,auVar239);
      auVar74 = vmaxps_avx(auVar194,auVar186);
      auVar74 = vmaxps_avx(auVar74,auVar76);
      auVar88 = vminps_avx512vl(auVar245,auVar80);
      auVar76 = vminps_avx(auVar211,auVar222);
      auVar76 = vminps_avx(auVar88,auVar76);
      auVar76 = vhaddps_avx(auVar85,auVar76);
      auVar96._0_16_ = vmaxps_avx512vl(auVar80,auVar245);
      auVar85 = vmaxps_avx(auVar222,auVar211);
      auVar85 = vmaxps_avx(auVar85,auVar96._0_16_);
      auVar74 = vhaddps_avx(auVar74,auVar85);
      auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
      auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar187._0_4_ = auVar76._0_4_ + auVar81._0_4_;
      auVar187._4_4_ = auVar76._4_4_ + auVar81._4_4_;
      auVar187._8_4_ = auVar76._8_4_ + auVar81._8_4_;
      auVar187._12_4_ = auVar76._12_4_ + auVar81._12_4_;
      auVar195._0_4_ = auVar74._0_4_ + auVar81._0_4_;
      auVar195._4_4_ = auVar74._4_4_ + auVar81._4_4_;
      auVar195._8_4_ = auVar74._8_4_ + auVar81._8_4_;
      auVar195._12_4_ = auVar74._12_4_ + auVar81._12_4_;
      auVar76 = vmaxps_avx(auVar75,auVar187);
      auVar74 = vminps_avx(auVar195,auVar78);
      uVar41 = vcmpps_avx512vl(auVar74,auVar76,1);
    } while ((uVar41 & 3) != 0);
    uVar41 = vcmpps_avx512vl(auVar195,auVar78,1);
    uVar12 = vcmpps_avx512vl(auVar63,auVar187,1);
    if (((ushort)uVar12 & (ushort)uVar41 & 1) == 0) {
      bVar30 = 0;
    }
    else {
      auVar76 = vmovshdup_avx(auVar187);
      bVar30 = auVar237._0_4_ < auVar76._0_4_ & (byte)(uVar41 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar45._0_4_;
    p03.field_0.i[1] = auVar45._4_4_;
    p03.field_0.i[2] = auVar45._8_4_;
    p03.field_0.i[3] = auVar45._12_4_;
    if (((3 < (uint)uVar32 || uVar135 != 0 && !bVar39) | bVar30) == 1) {
      lVar33 = 0xc9;
      do {
        lVar33 = lVar33 + -1;
        if (lVar33 == 0) goto LAB_01a2c859;
        auVar63 = vsubss_avx512f(auVar73,auVar81);
        fVar213 = auVar63._0_4_;
        fVar215 = fVar213 * fVar213 * fVar213;
        fVar214 = auVar81._0_4_;
        fVar205 = fVar214 * 3.0 * fVar213 * fVar213;
        fVar213 = fVar213 * fVar214 * fVar214 * 3.0;
        auVar164._4_4_ = fVar215;
        auVar164._0_4_ = fVar215;
        auVar164._8_4_ = fVar215;
        auVar164._12_4_ = fVar215;
        auVar159._4_4_ = fVar205;
        auVar159._0_4_ = fVar205;
        auVar159._8_4_ = fVar205;
        auVar159._12_4_ = fVar205;
        auVar137._4_4_ = fVar213;
        auVar137._0_4_ = fVar213;
        auVar137._8_4_ = fVar213;
        auVar137._12_4_ = fVar213;
        fVar214 = fVar214 * fVar214 * fVar214;
        auVar176._0_4_ = p03.field_0.v[0] * fVar214;
        auVar176._4_4_ = p03.field_0.v[1] * fVar214;
        auVar176._8_4_ = p03.field_0.v[2] * fVar214;
        auVar176._12_4_ = p03.field_0.v[3] * fVar214;
        auVar63 = vfmadd231ps_fma(auVar176,auVar44,auVar137);
        auVar63 = vfmadd231ps_fma(auVar63,auVar51,auVar159);
        auVar63 = vfmadd231ps_fma(auVar63,auVar5,auVar164);
        auVar138._8_8_ = auVar63._0_8_;
        auVar138._0_8_ = auVar63._0_8_;
        auVar63 = vshufpd_avx(auVar63,auVar63,3);
        auVar76 = vshufps_avx(auVar81,auVar81,0x55);
        auVar63 = vsubps_avx(auVar63,auVar138);
        auVar76 = vfmadd213ps_fma(auVar63,auVar76,auVar138);
        fVar215 = auVar76._0_4_;
        auVar63 = vshufps_avx(auVar76,auVar76,0x55);
        auVar139._0_4_ = auVar47._0_4_ * fVar215 + auVar86._0_4_ * auVar63._0_4_;
        auVar139._4_4_ = auVar47._4_4_ * fVar215 + auVar86._4_4_ * auVar63._4_4_;
        auVar139._8_4_ = auVar47._8_4_ * fVar215 + auVar86._8_4_ * auVar63._8_4_;
        auVar139._12_4_ = auVar47._12_4_ * fVar215 + auVar86._12_4_ * auVar63._12_4_;
        auVar81 = vsubps_avx(auVar81,auVar139);
        auVar63 = vandps_avx512vl(auVar76,auVar249._0_16_);
        auVar96._0_16_ = vprolq_avx512vl(auVar63,0x20);
        auVar63 = vmaxss_avx(auVar96._0_16_,auVar63);
        bVar39 = auVar63._0_4_ <= fVar136;
      } while (fVar136 <= auVar63._0_4_);
      auVar63 = vucomiss_avx512f(auVar84);
      if (bVar39) {
        auVar47 = vucomiss_avx512f(auVar63);
        auVar256 = ZEXT1664(auVar47);
        if (bVar39) {
          vmovshdup_avx(auVar63);
          auVar47 = vucomiss_avx512f(auVar84);
          if (bVar39) {
            auVar76 = vucomiss_avx512f(auVar47);
            auVar256 = ZEXT1664(auVar76);
            if (bVar39) {
              auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar83 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar73 = vdpps_avx(auVar83,auVar49,0x7f);
              auVar74 = vdpps_avx(auVar83,auVar58,0x7f);
              auVar75 = vdpps_avx(auVar83,auVar59,0x7f);
              auVar85 = vdpps_avx(auVar83,auVar60,0x7f);
              auVar88 = vdpps_avx(auVar83,auVar43,0x7f);
              auVar79 = vdpps_avx(auVar83,auVar61,0x7f);
              auVar80 = vdpps_avx(auVar83,auVar50,0x7f);
              auVar83 = vdpps_avx(auVar83,auVar62,0x7f);
              auVar81 = vsubss_avx512f(auVar76,auVar47);
              fVar214 = auVar47._0_4_;
              auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar88._0_4_)),auVar81,auVar73);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar214)),auVar81,auVar74);
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar214)),auVar81,auVar75);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar83._0_4_)),auVar81,auVar85);
              auVar96._0_16_ = vsubss_avx512f(auVar76,auVar63);
              auVar196._0_4_ = auVar96._0_4_;
              fVar215 = auVar196._0_4_ * auVar196._0_4_ * auVar196._0_4_;
              local_d8 = auVar63._0_4_;
              fVar205 = local_d8 * 3.0 * auVar196._0_4_ * auVar196._0_4_;
              fVar213 = auVar196._0_4_ * local_d8 * local_d8 * 3.0;
              fVar225 = local_d8 * local_d8 * local_d8;
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar75._0_4_)),
                                        ZEXT416((uint)fVar213),auVar74);
              auVar76 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar205),auVar73);
              auVar47 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar215),auVar47);
              fVar224 = auVar47._0_4_;
              if ((fVar1 <= fVar224) &&
                 (fVar226 = *(float *)(ray + k * 4 + 0x80), fVar224 <= fVar226)) {
                local_c8 = vshufps_avx(auVar63,auVar63,0x55);
                auVar89 = vsubps_avx512vl(auVar89,local_c8);
                fVar227 = local_c8._0_4_;
                auVar199._0_4_ = fVar227 * auVar228._0_4_;
                fVar234 = local_c8._4_4_;
                auVar199._4_4_ = fVar234 * auVar228._4_4_;
                fVar235 = local_c8._8_4_;
                auVar199._8_4_ = fVar235 * auVar228._8_4_;
                fVar236 = local_c8._12_4_;
                auVar199._12_4_ = fVar236 * auVar228._12_4_;
                local_288 = auVar56._0_4_;
                fStack_284 = auVar56._4_4_;
                fStack_280 = auVar56._8_4_;
                fStack_27c = auVar56._12_4_;
                auVar212._0_4_ = fVar227 * local_288;
                auVar212._4_4_ = fVar234 * fStack_284;
                auVar212._8_4_ = fVar235 * fStack_280;
                auVar212._12_4_ = fVar236 * fStack_27c;
                local_298 = auVar57._0_4_;
                fStack_294 = auVar57._4_4_;
                fStack_290 = auVar57._8_4_;
                fStack_28c = auVar57._12_4_;
                auVar223._0_4_ = fVar227 * local_298;
                auVar223._4_4_ = fVar234 * fStack_294;
                auVar223._8_4_ = fVar235 * fStack_290;
                auVar223._12_4_ = fVar236 * fStack_28c;
                local_258 = auVar53._0_4_;
                fStack_254 = auVar53._4_4_;
                fStack_250 = auVar53._8_4_;
                fStack_24c = auVar53._12_4_;
                auVar232._0_4_ = fVar227 * local_258;
                auVar232._4_4_ = fVar234 * fStack_254;
                auVar232._8_4_ = fVar235 * fStack_250;
                auVar232._12_4_ = fVar236 * fStack_24c;
                auVar63 = vfmadd231ps_fma(auVar199,auVar89,auVar48);
                auVar47 = vfmadd231ps_fma(auVar212,auVar89,auVar54);
                auVar76 = vfmadd231ps_fma(auVar223,auVar89,auVar55);
                auVar89 = vfmadd231ps_fma(auVar232,auVar89,auVar52);
                auVar63 = vsubps_avx(auVar47,auVar63);
                auVar47 = vsubps_avx(auVar76,auVar47);
                auVar76 = vsubps_avx(auVar89,auVar76);
                auVar233._0_4_ = local_d8 * auVar47._0_4_;
                auVar233._4_4_ = local_d8 * auVar47._4_4_;
                auVar233._8_4_ = local_d8 * auVar47._8_4_;
                auVar233._12_4_ = local_d8 * auVar47._12_4_;
                auVar196._4_4_ = auVar196._0_4_;
                auVar196._8_4_ = auVar196._0_4_;
                auVar196._12_4_ = auVar196._0_4_;
                auVar63 = vfmadd231ps_fma(auVar233,auVar196,auVar63);
                auVar200._0_4_ = local_d8 * auVar76._0_4_;
                auVar200._4_4_ = local_d8 * auVar76._4_4_;
                auVar200._8_4_ = local_d8 * auVar76._8_4_;
                auVar200._12_4_ = local_d8 * auVar76._12_4_;
                auVar47 = vfmadd231ps_fma(auVar200,auVar196,auVar47);
                auVar201._0_4_ = local_d8 * auVar47._0_4_;
                auVar201._4_4_ = local_d8 * auVar47._4_4_;
                auVar201._8_4_ = local_d8 * auVar47._8_4_;
                auVar201._12_4_ = local_d8 * auVar47._12_4_;
                auVar63 = vfmadd231ps_fma(auVar201,auVar196,auVar63);
                auVar96._0_16_ = vmulps_avx512vl(auVar63,auVar167);
                pGVar7 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar70._0_4_;
                  fStack_2d4 = auVar70._4_4_;
                  fStack_2d0 = auVar70._8_4_;
                  fStack_2cc = auVar70._12_4_;
                  auVar182._0_4_ = fVar225 * local_2d8;
                  auVar182._4_4_ = fVar225 * fStack_2d4;
                  auVar182._8_4_ = fVar225 * fStack_2d0;
                  auVar182._12_4_ = fVar225 * fStack_2cc;
                  auVar177._4_4_ = fVar213;
                  auVar177._0_4_ = fVar213;
                  auVar177._8_4_ = fVar213;
                  auVar177._12_4_ = fVar213;
                  auVar63 = vfmadd132ps_fma(auVar177,auVar182,auVar69);
                  auVar170._4_4_ = fVar205;
                  auVar170._0_4_ = fVar205;
                  auVar170._8_4_ = fVar205;
                  auVar170._12_4_ = fVar205;
                  auVar63 = vfmadd132ps_fma(auVar170,auVar63,auVar68);
                  auVar160._4_4_ = fVar215;
                  auVar160._0_4_ = fVar215;
                  auVar160._8_4_ = fVar215;
                  auVar160._12_4_ = fVar215;
                  auVar76 = vfmadd132ps_fma(auVar160,auVar63,auVar46);
                  auVar63 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar47 = vshufps_avx(auVar96._0_16_,auVar96._0_16_,0xc9);
                  auVar161._0_4_ = auVar76._0_4_ * auVar47._0_4_;
                  auVar161._4_4_ = auVar76._4_4_ * auVar47._4_4_;
                  auVar161._8_4_ = auVar76._8_4_ * auVar47._8_4_;
                  auVar161._12_4_ = auVar76._12_4_ * auVar47._12_4_;
                  auVar63 = vfmsub231ps_fma(auVar161,auVar96._0_16_,auVar63);
                  local_e8 = auVar63._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar224;
                    uVar143 = vextractps_avx(auVar63,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar143;
                    uVar143 = vextractps_avx(auVar63,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar143;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar214;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_358;
                    *(uint *)(ray + k * 4 + 0x120) = uVar6;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_01a2c859;
                  }
                  auVar47 = vshufps_avx(auVar63,auVar63,0x55);
                  local_f8 = vshufps_avx(auVar63,auVar63,0xaa);
                  local_108[0] = (RTCHitN)auVar47[0];
                  local_108[1] = (RTCHitN)auVar47[1];
                  local_108[2] = (RTCHitN)auVar47[2];
                  local_108[3] = (RTCHitN)auVar47[3];
                  local_108[4] = (RTCHitN)auVar47[4];
                  local_108[5] = (RTCHitN)auVar47[5];
                  local_108[6] = (RTCHitN)auVar47[6];
                  local_108[7] = (RTCHitN)auVar47[7];
                  local_108[8] = (RTCHitN)auVar47[8];
                  local_108[9] = (RTCHitN)auVar47[9];
                  local_108[10] = (RTCHitN)auVar47[10];
                  local_108[0xb] = (RTCHitN)auVar47[0xb];
                  local_108[0xc] = (RTCHitN)auVar47[0xc];
                  local_108[0xd] = (RTCHitN)auVar47[0xd];
                  local_108[0xe] = (RTCHitN)auVar47[0xe];
                  local_108[0xf] = (RTCHitN)auVar47[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_2f8 = auVar72._0_8_;
                  uStack_2f0 = auVar72._8_8_;
                  local_b8 = local_2f8;
                  uStack_b0 = uStack_2f0;
                  local_a8 = auVar71;
                  vpcmpeqd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar71));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar224;
                  args.valid = (int *)local_378;
                  args.geometryUserPtr = pGVar7->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_378 = auVar11;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_360 = context;
                    (*pGVar7->intersectionFilterN)(&args);
                    auVar63 = vxorps_avx512vl(auVar84,auVar84);
                    auVar255 = ZEXT1664(auVar63);
                    auVar256 = ZEXT464(0x3f800000);
                    auVar253 = ZEXT3264(_DAT_01fb9fe0);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar252 = ZEXT1664(auVar63);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar251 = ZEXT1664(auVar63);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar248 = ZEXT3264(auVar96);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar250 = ZEXT1664(auVar63);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar249 = ZEXT1664(auVar63);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar247 = ZEXT1664(auVar63);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar254 = ZEXT3264(auVar96);
                    context = local_360;
                  }
                  auVar63 = auVar255._0_16_;
                  uVar41 = vptestmd_avx512vl(local_378,local_378);
                  if ((uVar41 & 0xf) != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                      auVar63 = vxorps_avx512vl(auVar63,auVar63);
                      auVar255 = ZEXT1664(auVar63);
                      auVar256 = ZEXT464(0x3f800000);
                      auVar253 = ZEXT3264(_DAT_01fb9fe0);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar252 = ZEXT1664(auVar63);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar251 = ZEXT1664(auVar63);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar248 = ZEXT3264(auVar96);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar250 = ZEXT1664(auVar63);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar249 = ZEXT1664(auVar63);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar247 = ZEXT1664(auVar63);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar254 = ZEXT3264(auVar96);
                    }
                    uVar41 = vptestmd_avx512vl(local_378,local_378);
                    uVar41 = uVar41 & 0xf;
                    bVar30 = (byte)uVar41;
                    if (bVar30 != 0) {
                      iVar27 = *(int *)(args.hit + 4);
                      iVar28 = *(int *)(args.hit + 8);
                      iVar29 = *(int *)(args.hit + 0xc);
                      auVar131._16_16_ = auVar96._16_16_;
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar37 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar30 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar30 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar39 * iVar27 | (uint)!bVar39 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar40 * iVar28 | (uint)!bVar40 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar37 * iVar29 | (uint)!bVar37 * *(int *)(args.ray + 0xcc);
                      iVar27 = *(int *)(args.hit + 0x14);
                      iVar28 = *(int *)(args.hit + 0x18);
                      iVar29 = *(int *)(args.hit + 0x1c);
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar37 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar30 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar30 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar39 * iVar27 | (uint)!bVar39 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar40 * iVar28 | (uint)!bVar40 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar37 * iVar29 | (uint)!bVar37 * *(int *)(args.ray + 0xdc);
                      iVar27 = *(int *)(args.hit + 0x24);
                      iVar28 = *(int *)(args.hit + 0x28);
                      iVar29 = *(int *)(args.hit + 0x2c);
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar37 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar30 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar30 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar39 * iVar27 | (uint)!bVar39 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar40 * iVar28 | (uint)!bVar40 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar37 * iVar29 | (uint)!bVar37 * *(int *)(args.ray + 0xec);
                      iVar27 = *(int *)(args.hit + 0x34);
                      iVar28 = *(int *)(args.hit + 0x38);
                      iVar29 = *(int *)(args.hit + 0x3c);
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar37 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar30 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar30 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar39 * iVar27 | (uint)!bVar39 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar40 * iVar28 | (uint)!bVar40 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar37 * iVar29 | (uint)!bVar37 * *(int *)(args.ray + 0xfc);
                      iVar27 = *(int *)(args.ray + 0x104);
                      iVar28 = *(int *)(args.ray + 0x108);
                      iVar29 = *(int *)(args.ray + 0x10c);
                      auVar90._0_4_ =
                           (uint)(bVar30 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(args.ray + 0x100);
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      auVar90._4_4_ =
                           (uint)bVar39 * *(int *)(args.hit + 0x44) | (uint)!bVar39 * iVar27;
                      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
                      auVar90._8_4_ =
                           (uint)bVar39 * *(int *)(args.hit + 0x48) | (uint)!bVar39 * iVar28;
                      bVar39 = SUB81(uVar41 >> 3,0);
                      auVar90._12_4_ =
                           (uint)bVar39 * *(int *)(args.hit + 0x4c) | (uint)!bVar39 * iVar29;
                      auVar131._0_16_ = auVar90;
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar90;
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      uVar135 = bVar39 * auVar90._4_4_ | (uint)!bVar39 * iVar27;
                      auVar22._4_24_ = auVar131._8_24_;
                      auVar22._0_4_ = uVar135;
                      auVar132._0_8_ = auVar22._0_8_ << 0x20;
                      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
                      auVar132._8_4_ = bVar39 * auVar90._8_4_ | (uint)!bVar39 * iVar28;
                      bVar39 = SUB81(uVar41 >> 3,0);
                      auVar132._12_4_ = bVar39 * auVar90._12_4_ | (uint)!bVar39 * iVar29;
                      auVar132._16_16_ = auVar131._16_16_;
                      auVar63 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar63;
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      uVar135 = bVar39 * uVar135 | (uint)!bVar39 * iVar27;
                      auVar23._4_24_ = auVar132._8_24_;
                      auVar23._0_4_ = uVar135;
                      auVar133._0_8_ = auVar23._0_8_ << 0x20;
                      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
                      auVar133._8_4_ = bVar39 * auVar132._8_4_ | (uint)!bVar39 * iVar28;
                      bVar39 = SUB81(uVar41 >> 3,0);
                      auVar133._12_4_ = bVar39 * auVar132._12_4_ | (uint)!bVar39 * iVar29;
                      auVar133._16_16_ = auVar131._16_16_;
                      auVar63 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar63;
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      uVar135 = bVar39 * uVar135 | (uint)!bVar39 * iVar27;
                      auVar24._4_24_ = auVar133._8_24_;
                      auVar24._0_4_ = uVar135;
                      auVar134._0_8_ = auVar24._0_8_ << 0x20;
                      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
                      auVar134._8_4_ = bVar39 * auVar133._8_4_ | (uint)!bVar39 * iVar28;
                      bVar39 = SUB81(uVar41 >> 3,0);
                      auVar134._12_4_ = bVar39 * auVar133._12_4_ | (uint)!bVar39 * iVar29;
                      auVar134._16_16_ = auVar131._16_16_;
                      auVar63 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar63;
                      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
                      auVar25._4_24_ = auVar134._8_24_;
                      auVar25._0_4_ = bVar39 * uVar135 | (uint)!bVar39 * iVar27;
                      auVar96._0_8_ = auVar25._0_8_ << 0x20;
                      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
                      auVar96._8_4_ = bVar39 * auVar134._8_4_ | (uint)!bVar39 * iVar28;
                      bVar39 = SUB81(uVar41 >> 3,0);
                      auVar96._12_4_ = bVar39 * auVar134._12_4_ | (uint)!bVar39 * iVar29;
                      auVar96._16_16_ = auVar131._16_16_;
                      auVar63 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar63;
                      goto LAB_01a2c859;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar226;
                }
              }
            }
          }
        }
      }
      goto LAB_01a2c859;
    }
    auVar47 = vinsertps_avx(auVar237,auVar77,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }